

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse2::SubdivPatch1MBIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  float *pfVar9;
  float *pfVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  GridSOA *pGVar14;
  Geometry *pGVar15;
  size_t sVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [12];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  int iVar30;
  AABBNodeMB4D *node1;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  RTCRayN *pRVar34;
  RTCFilterFunctionN p_Var35;
  code *pcVar36;
  uint uVar37;
  char *pcVar39;
  undefined4 uVar40;
  ulong uVar41;
  char *pcVar42;
  char *pcVar43;
  Primitive_conflict3 *prim;
  ulong uVar44;
  long lVar45;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar46;
  char *pcVar47;
  char *pcVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  float fVar64;
  float fVar65;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar71;
  undefined1 auVar72 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar73;
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar125;
  float fVar137;
  float fVar138;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar139;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar140;
  float fVar141;
  float fVar150;
  float fVar152;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar151;
  float fVar153;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar154;
  float fVar163;
  float fVar164;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar165;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar166;
  float fVar173;
  float fVar174;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar175;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar176;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar177 [16];
  float fVar181;
  float fVar182;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar183 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar205;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar206 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar218 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  int iVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  int iVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  int iVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  undefined8 uStack_12f0;
  undefined4 uStack_12bc;
  float local_1298;
  float fStack_1294;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined4 uStack_125c;
  undefined8 local_1258;
  undefined8 uStack_1250;
  vbool<4> valid;
  undefined1 local_1238 [16];
  Precalculations *local_1228;
  char *local_1220;
  ulong local_1218;
  ulong local_1210;
  RTCFilterFunctionNArguments args;
  undefined8 local_11d8;
  vfloat<4> tNear;
  float local_1128 [4];
  float local_1118 [4];
  float local_1108 [4];
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8 [4];
  float local_10d8 [4];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  uint local_1058;
  uint uStack_1054;
  uint uStack_1050;
  uint uStack_104c;
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  int local_1038;
  int iStack_1034;
  int iStack_1030;
  int iStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  GridSOA *pGVar38;
  undefined1 auVar147 [16];
  
  pSVar46 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_fd8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_fe8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_ff8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1008 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1018 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1028 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1038 = (tray->tnear).field_0.i[k];
  iVar30 = (tray->tfar).field_0.i[k];
  auVar103._4_4_ = iVar30;
  auVar103._0_4_ = iVar30;
  auVar103._8_4_ = iVar30;
  auVar103._12_4_ = iVar30;
  lVar31 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  iStack_1034 = local_1038;
  iStack_1030 = local_1038;
  iStack_102c = local_1038;
  pGVar38 = (GridSOA *)k;
  fVar65 = local_1008;
  fVar64 = local_1008;
  fVar77 = local_1008;
  fVar74 = local_1008;
  fVar75 = local_1028;
  fVar76 = local_1028;
  fVar125 = local_1028;
  fVar137 = local_1028;
  iVar30 = local_1038;
  iVar230 = local_1038;
  iVar234 = local_1038;
  iVar238 = local_1038;
  fVar138 = local_fd8;
  fVar139 = local_fd8;
  fVar141 = local_fd8;
  fVar151 = local_fd8;
  fVar166 = local_fe8;
  fVar181 = local_fe8;
  fVar140 = local_fe8;
  fVar173 = local_fe8;
  fVar150 = local_ff8;
  fVar174 = local_ff8;
  fVar152 = local_ff8;
  fVar182 = local_ff8;
  fVar153 = local_1018;
  fVar184 = local_1018;
  fVar185 = local_1018;
  fVar176 = local_1018;
  local_1228 = pre;
LAB_00665609:
  do {
    do {
      if (pSVar46 == stack) {
        return;
      }
      pSVar29 = pSVar46 + -1;
      pSVar46 = pSVar46 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar29->dist &&
             (float)pSVar29->dist != *(float *)(ray + k * 4 + 0x80));
    uVar44 = (pSVar46->ptr).ptr;
    while ((uVar44 & 8) == 0) {
      uVar32 = uVar44 & 0xfffffffffffffff0;
      fVar186 = *(float *)(ray + k * 4 + 0x70);
      pfVar10 = (float *)(uVar32 + 0x80 + uVar50);
      pfVar9 = (float *)(uVar32 + 0x20 + uVar50);
      auVar126._0_4_ = ((*pfVar10 * fVar186 + *pfVar9) - fVar138) * fVar65;
      auVar126._4_4_ = ((pfVar10[1] * fVar186 + pfVar9[1]) - fVar139) * fVar64;
      auVar126._8_4_ = ((pfVar10[2] * fVar186 + pfVar9[2]) - fVar141) * fVar77;
      auVar126._12_4_ = ((pfVar10[3] * fVar186 + pfVar9[3]) - fVar151) * fVar74;
      auVar99._4_4_ = iVar230;
      auVar99._0_4_ = iVar30;
      auVar99._8_4_ = iVar234;
      auVar99._12_4_ = iVar238;
      auVar99 = maxps(auVar99,auVar126);
      pfVar10 = (float *)(uVar32 + 0x80 + uVar49);
      pfVar9 = (float *)(uVar32 + 0x20 + uVar49);
      auVar146._0_4_ = ((*pfVar10 * fVar186 + *pfVar9) - fVar166) * fVar153;
      auVar146._4_4_ = ((pfVar10[1] * fVar186 + pfVar9[1]) - fVar181) * fVar184;
      auVar146._8_4_ = ((pfVar10[2] * fVar186 + pfVar9[2]) - fVar140) * fVar185;
      auVar146._12_4_ = ((pfVar10[3] * fVar186 + pfVar9[3]) - fVar173) * fVar176;
      pfVar10 = (float *)(uVar32 + 0x80 + uVar51);
      pfVar9 = (float *)(uVar32 + 0x20 + uVar51);
      auVar157._0_4_ = ((*pfVar10 * fVar186 + *pfVar9) - fVar150) * fVar75;
      auVar157._4_4_ = ((pfVar10[1] * fVar186 + pfVar9[1]) - fVar174) * fVar76;
      auVar157._8_4_ = ((pfVar10[2] * fVar186 + pfVar9[2]) - fVar152) * fVar125;
      auVar157._12_4_ = ((pfVar10[3] * fVar186 + pfVar9[3]) - fVar182) * fVar137;
      auVar126 = maxps(auVar146,auVar157);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar99,auVar126);
      pfVar10 = (float *)(uVar32 + 0x80 + (uVar50 ^ 0x10));
      pfVar9 = (float *)(uVar32 + 0x20 + (uVar50 ^ 0x10));
      auVar168._0_4_ = ((*pfVar10 * fVar186 + *pfVar9) - fVar138) * fVar65;
      auVar168._4_4_ = ((pfVar10[1] * fVar186 + pfVar9[1]) - fVar139) * fVar64;
      auVar168._8_4_ = ((pfVar10[2] * fVar186 + pfVar9[2]) - fVar141) * fVar77;
      auVar168._12_4_ = ((pfVar10[3] * fVar186 + pfVar9[3]) - fVar151) * fVar74;
      auVar99 = minps(auVar103,auVar168);
      pfVar10 = (float *)(uVar32 + 0x80 + (uVar49 ^ 0x10));
      pfVar9 = (float *)(uVar32 + 0x20 + (uVar49 ^ 0x10));
      auVar142._0_4_ = ((*pfVar10 * fVar186 + *pfVar9) - fVar166) * fVar153;
      auVar142._4_4_ = ((pfVar10[1] * fVar186 + pfVar9[1]) - fVar181) * fVar184;
      auVar142._8_4_ = ((pfVar10[2] * fVar186 + pfVar9[2]) - fVar140) * fVar185;
      auVar142._12_4_ = ((pfVar10[3] * fVar186 + pfVar9[3]) - fVar173) * fVar176;
      pfVar10 = (float *)(uVar32 + 0x80 + (uVar51 ^ 0x10));
      pfVar9 = (float *)(uVar32 + 0x20 + (uVar51 ^ 0x10));
      auVar155._0_4_ = ((*pfVar10 * fVar186 + *pfVar9) - fVar150) * fVar75;
      auVar155._4_4_ = ((pfVar10[1] * fVar186 + pfVar9[1]) - fVar174) * fVar76;
      auVar155._8_4_ = ((pfVar10[2] * fVar186 + pfVar9[2]) - fVar152) * fVar125;
      auVar155._12_4_ = ((pfVar10[3] * fVar186 + pfVar9[3]) - fVar182) * fVar137;
      auVar126 = minps(auVar142,auVar155);
      auVar99 = minps(auVar99,auVar126);
      if (((uint)uVar44 & 7) == 6) {
        bVar17 = (fVar186 < *(float *)(uVar32 + 0xf0) && *(float *)(uVar32 + 0xe0) <= fVar186) &&
                 tNear.field_0._0_4_ <= auVar99._0_4_;
        bVar18 = (fVar186 < *(float *)(uVar32 + 0xf4) && *(float *)(uVar32 + 0xe4) <= fVar186) &&
                 tNear.field_0._4_4_ <= auVar99._4_4_;
        bVar19 = (fVar186 < *(float *)(uVar32 + 0xf8) && *(float *)(uVar32 + 0xe8) <= fVar186) &&
                 tNear.field_0._8_4_ <= auVar99._8_4_;
        bVar20 = (fVar186 < *(float *)(uVar32 + 0xfc) && *(float *)(uVar32 + 0xec) <= fVar186) &&
                 tNear.field_0._12_4_ <= auVar99._12_4_;
      }
      else {
        bVar17 = tNear.field_0._0_4_ <= auVar99._0_4_;
        bVar18 = tNear.field_0._4_4_ <= auVar99._4_4_;
        bVar19 = tNear.field_0._8_4_ <= auVar99._8_4_;
        bVar20 = tNear.field_0._12_4_ <= auVar99._12_4_;
      }
      auVar78._0_4_ = (uint)bVar17 * -0x80000000;
      auVar78._4_4_ = (uint)bVar18 * -0x80000000;
      auVar78._8_4_ = (uint)bVar19 * -0x80000000;
      auVar78._12_4_ = (uint)bVar20 * -0x80000000;
      uVar37 = movmskps((int)pGVar38,auVar78);
      pGVar38 = (GridSOA *)(ulong)uVar37;
      if (uVar37 == 0) goto LAB_00665609;
      pGVar38 = (GridSOA *)0x0;
      if ((byte)uVar37 != 0) {
        for (; ((byte)uVar37 >> (long)pGVar38 & 1) == 0;
            pGVar38 = (GridSOA *)((long)&(pGVar38->troot).ptr + 1)) {
        }
      }
      uVar44 = *(ulong *)(uVar32 + (long)pGVar38 * 8);
      uVar37 = (uVar37 & 0xff) - 1 & uVar37 & 0xff;
      if (uVar37 != 0) {
        uVar52 = tNear.field_0.i[(long)pGVar38];
        lVar45 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
          }
        }
        uVar33 = *(ulong *)(uVar32 + lVar45 * 8);
        uVar53 = tNear.field_0.i[lVar45];
        uVar37 = uVar37 - 1 & uVar37;
        pGVar38 = (GridSOA *)(ulong)uVar37;
        if (uVar37 == 0) {
          if (uVar52 < uVar53) {
            (pSVar46->ptr).ptr = uVar33;
            pSVar46->dist = uVar53;
            pSVar46 = pSVar46 + 1;
          }
          else {
            (pSVar46->ptr).ptr = uVar44;
            pSVar46->dist = uVar52;
            uVar44 = uVar33;
            pSVar46 = pSVar46 + 1;
          }
        }
        else {
          auVar79._8_4_ = uVar52;
          auVar79._0_8_ = uVar44;
          auVar79._12_4_ = 0;
          auVar100._8_4_ = uVar53;
          auVar100._0_8_ = uVar33;
          auVar100._12_4_ = 0;
          lVar45 = 0;
          if (pGVar38 != (GridSOA *)0x0) {
            for (; (uVar37 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
            }
          }
          uVar44 = *(ulong *)(uVar32 + lVar45 * 8);
          iVar12 = tNear.field_0.i[lVar45];
          auVar127._8_4_ = iVar12;
          auVar127._0_8_ = uVar44;
          auVar127._12_4_ = 0;
          auVar143._8_4_ = -(uint)((int)uVar52 < (int)uVar53);
          uVar37 = uVar37 - 1 & uVar37;
          if (uVar37 == 0) {
            auVar143._4_4_ = auVar143._8_4_;
            auVar143._0_4_ = auVar143._8_4_;
            auVar143._12_4_ = auVar143._8_4_;
            auVar99 = auVar79 & auVar143 | ~auVar143 & auVar100;
            auVar126 = auVar100 & auVar143 | ~auVar143 & auVar79;
            auVar144._8_4_ = -(uint)(auVar99._8_4_ < iVar12);
            auVar144._0_8_ = CONCAT44(auVar144._8_4_,auVar144._8_4_);
            auVar144._12_4_ = auVar144._8_4_;
            uVar44 = ~auVar144._0_8_ & uVar44 | auVar99._0_8_ & auVar144._0_8_;
            auVar99 = auVar127 & auVar144 | ~auVar144 & auVar99;
            auVar80._8_4_ = -(uint)(auVar126._8_4_ < auVar99._8_4_);
            auVar80._4_4_ = auVar80._8_4_;
            auVar80._0_4_ = auVar80._8_4_;
            auVar80._12_4_ = auVar80._8_4_;
            *pSVar46 = (StackItemT<embree::NodeRefPtr<4>_>)(~auVar80 & auVar126 | auVar99 & auVar80)
            ;
            pSVar46[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (auVar126 & auVar80 | ~auVar80 & auVar99);
            pSVar46 = pSVar46 + 2;
          }
          else {
            pGVar38 = (GridSOA *)0x0;
            if (uVar37 != 0) {
              for (; (uVar37 >> (long)pGVar38 & 1) == 0;
                  pGVar38 = (GridSOA *)((long)&(pGVar38->troot).ptr + 1)) {
              }
            }
            iVar13 = tNear.field_0.i[(long)pGVar38];
            auVar156._8_4_ = iVar13;
            auVar156._0_8_ = *(undefined8 *)(uVar32 + (long)pGVar38 * 8);
            auVar156._12_4_ = 0;
            auVar145._4_4_ = auVar143._8_4_;
            auVar145._0_4_ = auVar143._8_4_;
            auVar145._8_4_ = auVar143._8_4_;
            auVar145._12_4_ = auVar143._8_4_;
            auVar99 = auVar79 & auVar145 | ~auVar145 & auVar100;
            auVar126 = auVar100 & auVar145 | ~auVar145 & auVar79;
            auVar167._0_4_ = -(uint)(iVar12 < iVar13);
            auVar167._4_4_ = -(uint)(iVar12 < iVar13);
            auVar167._8_4_ = -(uint)(iVar12 < iVar13);
            auVar167._12_4_ = -(uint)(iVar12 < iVar13);
            auVar146 = auVar127 & auVar167 | ~auVar167 & auVar156;
            auVar168 = ~auVar167 & auVar127 | auVar156 & auVar167;
            auVar128._8_4_ = -(uint)(auVar126._8_4_ < auVar168._8_4_);
            auVar128._4_4_ = auVar128._8_4_;
            auVar128._0_4_ = auVar128._8_4_;
            auVar128._12_4_ = auVar128._8_4_;
            auVar157 = auVar126 & auVar128 | ~auVar128 & auVar168;
            auVar101._8_4_ = -(uint)(auVar99._8_4_ < auVar146._8_4_);
            auVar101._0_8_ = CONCAT44(auVar101._8_4_,auVar101._8_4_);
            auVar101._12_4_ = auVar101._8_4_;
            uVar44 = auVar99._0_8_ & auVar101._0_8_ | ~auVar101._0_8_ & auVar146._0_8_;
            auVar99 = ~auVar101 & auVar99 | auVar146 & auVar101;
            auVar81._8_4_ = -(uint)(auVar99._8_4_ < auVar157._8_4_);
            auVar81._4_4_ = auVar81._8_4_;
            auVar81._0_4_ = auVar81._8_4_;
            auVar81._12_4_ = auVar81._8_4_;
            *pSVar46 = (StackItemT<embree::NodeRefPtr<4>_>)
                       (~auVar128 & auVar126 | auVar168 & auVar128);
            pSVar46[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar81 & auVar99 | auVar157 & auVar81);
            pSVar46[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (auVar99 & auVar81 | ~auVar81 & auVar157);
            pSVar46 = pSVar46 + 3;
          }
        }
      }
    }
    if (((uint)uVar44 & 0xf) == 8) {
      pGVar14 = (local_1228->super_Precalculations).grid;
      fVar77 = (float)(pGVar14->time_steps - 1);
      uVar32 = (ulong)pGVar14->width;
      fVar64 = *(float *)(ray + k * 4 + 0x70) * fVar77;
      fVar65 = floorf(fVar64);
      fVar77 = fVar77 + -1.0;
      if (fVar77 <= fVar65) {
        fVar65 = fVar77;
      }
      fVar77 = 0.0;
      if (0.0 <= fVar65) {
        fVar77 = fVar65;
      }
      lVar45 = (long)(int)fVar77 * (ulong)pGVar14->gridBytes + (ulong)pGVar14->gridOffset;
      uVar44 = uVar44 >> 4;
      pGVar1 = (GridSOA *)(pGVar14->data + uVar44 * 4 + lVar45 + -0x30);
      pcVar6 = pGVar14->data + uVar44 * 4 + lVar45 + -4;
      fVar65 = *(float *)(pcVar6 + 4);
      pcVar39 = pGVar1->data + uVar32 * 4 + -4;
      fVar74 = *(float *)(pcVar39 + 4);
      fVar75 = *(float *)(pcVar6 + 8);
      fVar76 = *(float *)(pcVar39 + 8);
      if (uVar32 == 2) {
        fVar75 = fVar65;
        fVar76 = fVar74;
      }
      uVar33 = (ulong)pGVar14->dim_offset;
      uVar37 = pGVar14->height;
      uVar41 = (ulong)uVar37;
      pcVar47 = pGVar1->data + uVar33 * 4 + -4;
      fVar125 = *(float *)(pGVar1->data + uVar33 * 4);
      pcVar2 = pcVar47 + uVar32 * 4;
      fVar137 = *(float *)(pcVar2 + 4);
      fVar138 = *(float *)(pcVar2 + 8);
      fVar139 = *(float *)(pGVar1->data + uVar33 * 4 + 4);
      if (uVar32 == 2) {
        fVar138 = fVar137;
        fVar139 = fVar125;
      }
      pcVar42 = pGVar1->data + uVar33 * 8 + -4;
      fVar141 = *(float *)(pGVar1->data + uVar33 * 8);
      pcVar3 = pcVar42 + uVar32 * 4;
      fVar151 = *(float *)(pcVar3 + 4);
      fVar166 = *(float *)(pGVar1->data + uVar33 * 8 + 4);
      fVar181 = *(float *)(pcVar3 + 8);
      if (uVar32 == 2) {
        fVar166 = fVar141;
        fVar181 = fVar151;
      }
      lVar45 = uVar44 * 4 + lVar45 + 0x2c;
      uVar44 = (ulong)(pGVar14->gridBytes & 0xfffffffc);
      pcVar7 = pGVar14->data + uVar44 + lVar45 + -0x30;
      fVar140 = *(float *)(pcVar7 + 4);
      pcVar8 = pGVar14->data + uVar32 * 4 + uVar44 + lVar45 + -0x30;
      fVar173 = *(float *)(pcVar8 + 4);
      fVar150 = *(float *)(pcVar7 + 8);
      fVar174 = *(float *)(pcVar8 + 8);
      if (uVar32 == 2) {
        fVar150 = fVar140;
        fVar174 = fVar173;
      }
      pcVar48 = pcVar47 + uVar44;
      fVar152 = *(float *)(pcVar48 + 4);
      pcVar4 = pcVar48 + uVar32 * 4;
      fVar182 = *(float *)(pcVar4 + 4);
      fVar153 = *(float *)(pcVar48 + 8);
      fVar184 = *(float *)(pcVar4 + 8);
      if (uVar32 == 2) {
        fVar153 = fVar152;
        fVar184 = fVar182;
      }
      fVar64 = fVar64 - fVar77;
      pcVar43 = pcVar42 + uVar44;
      fVar77 = *(float *)(pcVar43 + 4);
      pcVar5 = pcVar43 + uVar32 * 4;
      fVar185 = *(float *)(pcVar5 + 4);
      fVar176 = *(float *)(pcVar43 + 8);
      fVar186 = *(float *)(pcVar5 + 8);
      if (uVar32 == 2) {
        fVar176 = fVar77;
        fVar186 = fVar185;
      }
      local_1220 = pGVar1->data + uVar33 * 0xc + -4;
      fVar217 = 1.0 - fVar64;
      local_1298 = (float)*(undefined8 *)pcVar3;
      fStack_1294 = (float)((ulong)*(undefined8 *)pcVar3 >> 0x20);
      fVar180 = *(float *)(ray + k * 4);
      fVar175 = *(float *)(ray + k * 4 + 0x10);
      fVar216 = *(float *)(ray + k * 4 + 0x20);
      fVar11 = *(float *)(ray + k * 4 + 0x40);
      fVar198 = (*(float *)pcVar6 * fVar217 + *(float *)pcVar7 * fVar64) - fVar180;
      fVar201 = (*(float *)pcVar39 * fVar217 + *(float *)pcVar8 * fVar64) - fVar180;
      fVar202 = (fVar65 * fVar217 + fVar140 * fVar64) - fVar180;
      fVar203 = (fVar74 * fVar217 + fVar173 * fVar64) - fVar180;
      fVar204 = (*(float *)pcVar47 * fVar217 + *(float *)pcVar48 * fVar64) - fVar175;
      fVar207 = (*(float *)pcVar2 * fVar217 + *(float *)pcVar4 * fVar64) - fVar175;
      fVar209 = (fVar125 * fVar217 + fVar152 * fVar64) - fVar175;
      fVar211 = (fVar137 * fVar217 + fVar182 * fVar64) - fVar175;
      fVar227 = (*(float *)pcVar42 * fVar217 + *(float *)pcVar43 * fVar64) - fVar216;
      fVar231 = (*(float *)pcVar3 * fVar217 + *(float *)pcVar5 * fVar64) - fVar216;
      fVar235 = (fVar141 * fVar217 + fVar77 * fVar64) - fVar216;
      fVar239 = (fVar151 * fVar217 + fVar185 * fVar64) - fVar216;
      fVar154 = (fVar65 * fVar217 + fVar140 * fVar64) - fVar180;
      fVar163 = (fVar65 * fVar217 + fVar140 * fVar64) - fVar180;
      fVar164 = (fVar75 * fVar217 + fVar150 * fVar64) - fVar180;
      fVar165 = (fVar75 * fVar217 + fVar150 * fVar64) - fVar180;
      fVar140 = (fVar125 * fVar217 + fVar152 * fVar64) - fVar175;
      fVar150 = (fVar125 * fVar217 + fVar152 * fVar64) - fVar175;
      fVar152 = (fVar139 * fVar217 + fVar153 * fVar64) - fVar175;
      fVar153 = (fVar139 * fVar217 + fVar153 * fVar64) - fVar175;
      fVar190 = (fVar141 * fVar217 + fVar77 * fVar64) - fVar216;
      fVar192 = (fVar141 * fVar217 + fVar77 * fVar64) - fVar216;
      fVar194 = (fVar166 * fVar217 + fVar176 * fVar64) - fVar216;
      fVar196 = (fVar166 * fVar217 + fVar176 * fVar64) - fVar216;
      fVar176 = (*(float *)pcVar39 * fVar217 + *(float *)pcVar8 * fVar64) - fVar180;
      fVar178 = (fVar74 * fVar217 + fVar173 * fVar64) - fVar180;
      fVar179 = (fVar74 * fVar217 + fVar173 * fVar64) - fVar180;
      fVar180 = (fVar76 * fVar217 + fVar174 * fVar64) - fVar180;
      fVar166 = (*(float *)pcVar2 * fVar217 + *(float *)pcVar4 * fVar64) - fVar175;
      fVar173 = (fVar137 * fVar217 + fVar182 * fVar64) - fVar175;
      fVar174 = (fVar137 * fVar217 + fVar182 * fVar64) - fVar175;
      fVar175 = (fVar138 * fVar217 + fVar184 * fVar64) - fVar175;
      fVar213 = (local_1298 * fVar217 + *(float *)pcVar5 * fVar64) - fVar216;
      fVar214 = (fStack_1294 * fVar217 + fVar185 * fVar64) - fVar216;
      fVar215 = (fVar151 * fVar217 + fVar185 * fVar64) - fVar216;
      fVar216 = (fVar181 * fVar217 + fVar186 * fVar64) - fVar216;
      fVar181 = fVar176 - fVar198;
      fVar184 = fVar178 - fVar201;
      fVar186 = fVar179 - fVar202;
      fVar188 = fVar180 - fVar203;
      local_f98 = fVar166 - fVar204;
      fStack_f94 = fVar173 - fVar207;
      fStack_f90 = fVar174 - fVar209;
      fStack_f8c = fVar175 - fVar211;
      local_f88 = fVar213 - fVar227;
      fStack_f84 = fVar214 - fVar231;
      fStack_f80 = fVar215 - fVar235;
      fStack_f7c = fVar216 - fVar239;
      fVar65 = *(float *)(ray + k * 4 + 0x50);
      local_fa8 = *(float *)(ray + k * 4 + 0x60);
      fVar125 = fVar198 - fVar154;
      fVar137 = fVar201 - fVar163;
      fVar138 = fVar202 - fVar164;
      fVar139 = fVar203 - fVar165;
      fVar141 = (local_f98 * (fVar213 + fVar227) - (fVar166 + fVar204) * local_f88) * fVar11 +
                ((fVar176 + fVar198) * local_f88 - (fVar213 + fVar227) * fVar181) * fVar65 +
                (fVar181 * (fVar166 + fVar204) - (fVar176 + fVar198) * local_f98) * local_fa8;
      fVar151 = (fStack_f94 * (fVar214 + fVar231) - (fVar173 + fVar207) * fStack_f84) * fVar11 +
                ((fVar178 + fVar201) * fStack_f84 - (fVar214 + fVar231) * fVar184) * fVar65 +
                (fVar184 * (fVar173 + fVar207) - (fVar178 + fVar201) * fStack_f94) * local_fa8;
      auVar147._0_8_ = CONCAT44(fVar151,fVar141);
      auVar147._8_4_ =
           (fStack_f90 * (fVar215 + fVar235) - (fVar174 + fVar209) * fStack_f80) * fVar11 +
           ((fVar179 + fVar202) * fStack_f80 - (fVar215 + fVar235) * fVar186) * fVar65 +
           (fVar186 * (fVar174 + fVar209) - (fVar179 + fVar202) * fStack_f90) * local_fa8;
      auVar147._12_4_ =
           (fStack_f8c * (fVar216 + fVar239) - (fVar175 + fVar211) * fStack_f7c) * fVar11 +
           ((fVar180 + fVar203) * fStack_f7c - (fVar216 + fVar239) * fVar188) * fVar65 +
           (fVar188 * (fVar175 + fVar211) - (fVar180 + fVar203) * fStack_f8c) * local_fa8;
      fVar182 = fVar204 - fVar140;
      fVar185 = fVar207 - fVar150;
      fVar187 = fVar209 - fVar152;
      fVar189 = fVar211 - fVar153;
      local_fb8 = fVar227 - fVar190;
      fStack_fb4 = fVar231 - fVar192;
      fStack_fb0 = fVar235 - fVar194;
      fStack_fac = fVar239 - fVar196;
      fVar191 = (fVar182 * (fVar227 + fVar190) - (fVar204 + fVar140) * local_fb8) * fVar11 +
                ((fVar198 + fVar154) * local_fb8 - (fVar227 + fVar190) * fVar125) * fVar65 +
                (fVar125 * (fVar204 + fVar140) - (fVar198 + fVar154) * fVar182) * local_fa8;
      fVar193 = (fVar185 * (fVar231 + fVar192) - (fVar207 + fVar150) * fStack_fb4) * fVar11 +
                ((fVar201 + fVar163) * fStack_fb4 - (fVar231 + fVar192) * fVar137) * fVar65 +
                (fVar137 * (fVar207 + fVar150) - (fVar201 + fVar163) * fVar185) * local_fa8;
      fVar195 = (fVar187 * (fVar235 + fVar194) - (fVar209 + fVar152) * fStack_fb0) * fVar11 +
                ((fVar202 + fVar164) * fStack_fb0 - (fVar235 + fVar194) * fVar138) * fVar65 +
                (fVar138 * (fVar209 + fVar152) - (fVar202 + fVar164) * fVar187) * local_fa8;
      fVar197 = (fVar189 * (fVar239 + fVar196) - (fVar211 + fVar153) * fStack_fac) * fVar11 +
                ((fVar203 + fVar165) * fStack_fac - (fVar239 + fVar196) * fVar139) * fVar65 +
                (fVar139 * (fVar211 + fVar153) - (fVar203 + fVar165) * fVar189) * local_fa8;
      fVar220 = fVar154 - fVar176;
      fVar222 = fVar163 - fVar178;
      fVar224 = fVar164 - fVar179;
      fVar226 = fVar165 - fVar180;
      fVar205 = fVar140 - fVar166;
      fVar208 = fVar150 - fVar173;
      fVar210 = fVar152 - fVar174;
      fVar212 = fVar153 - fVar175;
      fVar77 = fVar190 - fVar213;
      fVar74 = fVar192 - fVar214;
      fVar75 = fVar194 - fVar215;
      fVar76 = fVar196 - fVar216;
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      auVar82._0_4_ =
           (fVar205 * (fVar213 + fVar190) - (fVar166 + fVar140) * fVar77) * fVar11 +
           ((fVar176 + fVar154) * fVar77 - (fVar213 + fVar190) * fVar220) * fVar65 +
           (fVar220 * (fVar166 + fVar140) - (fVar176 + fVar154) * fVar205) * local_fa8;
      auVar82._4_4_ =
           (fVar208 * (fVar214 + fVar192) - (fVar173 + fVar150) * fVar74) * fVar11 +
           ((fVar178 + fVar163) * fVar74 - (fVar214 + fVar192) * fVar222) * fVar65 +
           (fVar222 * (fVar173 + fVar150) - (fVar178 + fVar163) * fVar208) * local_fa8;
      auVar82._8_4_ =
           (fVar210 * (fVar215 + fVar194) - (fVar174 + fVar152) * fVar75) * fVar11 +
           ((fVar179 + fVar164) * fVar75 - (fVar215 + fVar194) * fVar224) * fVar65 +
           (fVar224 * (fVar174 + fVar152) - (fVar179 + fVar164) * fVar210) * local_fa8;
      auVar82._12_4_ =
           (fVar212 * (fVar216 + fVar196) - (fVar175 + fVar153) * fVar76) * fVar11 +
           ((fVar180 + fVar165) * fVar76 - (fVar216 + fVar196) * fVar226) * fVar65 +
           (fVar226 * (fVar175 + fVar153) - (fVar180 + fVar165) * fVar212) * local_fa8;
      auVar169._0_4_ = fVar141 + fVar191 + auVar82._0_4_;
      auVar169._4_4_ = fVar151 + fVar193 + auVar82._4_4_;
      auVar169._8_4_ = auVar147._8_4_ + fVar195 + auVar82._8_4_;
      auVar169._12_4_ = auVar147._12_4_ + fVar197 + auVar82._12_4_;
      auVar102._8_4_ = auVar147._8_4_;
      auVar102._0_8_ = auVar147._0_8_;
      auVar102._12_4_ = auVar147._12_4_;
      auVar21._4_4_ = fVar193;
      auVar21._0_4_ = fVar191;
      auVar21._8_4_ = fVar195;
      auVar21._12_4_ = fVar197;
      auVar103 = minps(auVar102,auVar21);
      auVar103 = minps(auVar103,auVar82);
      auVar158._8_4_ = auVar147._8_4_;
      auVar158._0_8_ = auVar147._0_8_;
      auVar158._12_4_ = auVar147._12_4_;
      auVar22._4_4_ = fVar193;
      auVar22._0_4_ = fVar191;
      auVar22._8_4_ = fVar195;
      auVar22._12_4_ = fVar197;
      auVar99 = maxps(auVar158,auVar22);
      auVar99 = maxps(auVar99,auVar82);
      local_fc8 = ABS(auVar169._0_4_);
      fStack_fc4 = ABS(auVar169._4_4_);
      fStack_fc0 = ABS(auVar169._8_4_);
      fStack_fbc = ABS(auVar169._12_4_);
      auVar159._4_4_ = -(uint)(auVar99._4_4_ <= fStack_fc4 * 1.1920929e-07);
      auVar159._0_4_ = -(uint)(auVar99._0_4_ <= local_fc8 * 1.1920929e-07);
      auVar159._8_4_ = -(uint)(auVar99._8_4_ <= fStack_fc0 * 1.1920929e-07);
      auVar159._12_4_ = -(uint)(auVar99._12_4_ <= fStack_fbc * 1.1920929e-07);
      auVar104._4_4_ = -(uint)(-(fStack_fc4 * 1.1920929e-07) <= auVar103._4_4_);
      auVar104._0_4_ = -(uint)(-(local_fc8 * 1.1920929e-07) <= auVar103._0_4_);
      auVar104._8_4_ = -(uint)(-(fStack_fc0 * 1.1920929e-07) <= auVar103._8_4_);
      auVar104._12_4_ = -(uint)(-(fStack_fbc * 1.1920929e-07) <= auVar103._12_4_);
      auVar159 = auVar159 | auVar104;
      iVar30 = movmskps(uVar37,auVar159);
      pGVar38 = pGVar1;
      local_1218 = uVar32;
      local_1210 = uVar41;
      if (iVar30 != 0) {
        uVar52 = -(uint)(ABS(fVar205 * local_fb8) <= ABS(fVar182 * local_f88));
        uVar55 = -(uint)(ABS(fVar208 * fStack_fb4) <= ABS(fVar185 * fStack_f84));
        uVar58 = -(uint)(ABS(fVar210 * fStack_fb0) <= ABS(fVar187 * fStack_f80));
        uVar61 = -(uint)(ABS(fVar212 * fStack_fac) <= ABS(fVar189 * fStack_f7c));
        uVar53 = -(uint)(ABS(fVar125 * fVar77) <= ABS(fVar181 * local_fb8));
        uVar56 = -(uint)(ABS(fVar137 * fVar74) <= ABS(fVar184 * fStack_fb4));
        uVar59 = -(uint)(ABS(fVar138 * fVar75) <= ABS(fVar186 * fStack_fb0));
        uVar62 = -(uint)(ABS(fVar139 * fVar76) <= ABS(fVar188 * fStack_fac));
        uVar54 = -(uint)(ABS(fVar220 * fVar182) <= ABS(fVar125 * local_f98));
        uVar57 = -(uint)(ABS(fVar222 * fVar185) <= ABS(fVar137 * fStack_f94));
        uVar60 = -(uint)(ABS(fVar224 * fVar187) <= ABS(fVar138 * fStack_f90));
        uVar63 = -(uint)(ABS(fVar226 * fVar189) <= ABS(fVar139 * fStack_f8c));
        auVar183._0_4_ = (uint)(fVar182 * fVar77 - fVar205 * local_fb8) & uVar52;
        auVar183._4_4_ = (uint)(fVar185 * fVar74 - fVar208 * fStack_fb4) & uVar55;
        auVar183._8_4_ = (uint)(fVar187 * fVar75 - fVar210 * fStack_fb0) & uVar58;
        auVar183._12_4_ = (uint)(fVar189 * fVar76 - fVar212 * fStack_fac) & uVar61;
        auVar83._0_4_ = ~uVar52 & (uint)(local_f98 * local_fb8 - fVar182 * local_f88);
        auVar83._4_4_ = ~uVar55 & (uint)(fStack_f94 * fStack_fb4 - fVar185 * fStack_f84);
        auVar83._8_4_ = ~uVar58 & (uint)(fStack_f90 * fStack_fb0 - fVar187 * fStack_f80);
        auVar83._12_4_ = ~uVar61 & (uint)(fStack_f8c * fStack_fac - fVar189 * fStack_f7c);
        auVar83 = auVar83 | auVar183;
        fVar173 = (float)(~uVar53 & (uint)(local_f88 * fVar125 - fVar181 * local_fb8) |
                         (uint)(fVar220 * local_fb8 - fVar125 * fVar77) & uVar53);
        fVar150 = (float)(~uVar56 & (uint)(fStack_f84 * fVar137 - fVar184 * fStack_fb4) |
                         (uint)(fVar222 * fStack_fb4 - fVar137 * fVar74) & uVar56);
        fVar174 = (float)(~uVar59 & (uint)(fStack_f80 * fVar138 - fVar186 * fStack_fb0) |
                         (uint)(fVar224 * fStack_fb0 - fVar138 * fVar75) & uVar59);
        fVar152 = (float)(~uVar62 & (uint)(fStack_f7c * fVar139 - fVar188 * fStack_fac) |
                         (uint)(fVar226 * fStack_fac - fVar139 * fVar76) & uVar62);
        fVar74 = (float)(~uVar54 & (uint)(fVar181 * fVar182 - fVar125 * local_f98) |
                        (uint)(fVar125 * fVar205 - fVar220 * fVar182) & uVar54);
        fVar75 = (float)(~uVar57 & (uint)(fVar184 * fVar185 - fVar137 * fStack_f94) |
                        (uint)(fVar137 * fVar208 - fVar222 * fVar185) & uVar57);
        fVar76 = (float)(~uVar60 & (uint)(fVar186 * fVar187 - fVar138 * fStack_f90) |
                        (uint)(fVar138 * fVar210 - fVar224 * fVar187) & uVar60);
        fVar125 = (float)(~uVar63 & (uint)(fVar188 * fVar189 - fVar139 * fStack_f8c) |
                         (uint)(fVar139 * fVar212 - fVar226 * fVar189) & uVar63);
        fVar182 = fVar11 * auVar83._0_4_ + fVar65 * fVar173 + local_fa8 * fVar74;
        fVar153 = fVar11 * auVar83._4_4_ + fVar65 * fVar150 + local_fa8 * fVar75;
        fVar184 = fVar11 * auVar83._8_4_ + fVar65 * fVar174 + local_fa8 * fVar76;
        fVar185 = fVar11 * auVar83._12_4_ + fVar65 * fVar152 + local_fa8 * fVar125;
        fVar182 = fVar182 + fVar182;
        fVar153 = fVar153 + fVar153;
        fVar184 = fVar184 + fVar184;
        fVar185 = fVar185 + fVar185;
        auVar105._0_4_ = fVar204 * fVar173 + fVar227 * fVar74;
        auVar105._4_4_ = fVar207 * fVar150 + fVar231 * fVar75;
        auVar105._8_4_ = fVar209 * fVar174 + fVar235 * fVar76;
        auVar105._12_4_ = fVar211 * fVar152 + fVar239 * fVar125;
        fVar139 = fVar198 * auVar83._0_4_ + auVar105._0_4_;
        fVar166 = fVar201 * auVar83._4_4_ + auVar105._4_4_;
        fVar181 = fVar202 * auVar83._8_4_ + auVar105._8_4_;
        fVar140 = fVar203 * auVar83._12_4_ + auVar105._12_4_;
        auVar25._4_4_ = fVar153;
        auVar25._0_4_ = fVar182;
        auVar25._8_4_ = fVar184;
        auVar25._12_4_ = fVar185;
        auVar103 = rcpps(auVar105,auVar25);
        fVar65 = auVar103._0_4_;
        fVar77 = auVar103._4_4_;
        fVar137 = auVar103._8_4_;
        fVar138 = auVar103._12_4_;
        fVar139 = ((1.0 - fVar182 * fVar65) * fVar65 + fVar65) * (fVar139 + fVar139);
        fVar166 = ((1.0 - fVar153 * fVar77) * fVar77 + fVar77) * (fVar166 + fVar166);
        fVar137 = ((1.0 - fVar184 * fVar137) * fVar137 + fVar137) * (fVar181 + fVar181);
        fVar138 = ((1.0 - fVar185 * fVar138) * fVar138 + fVar138) * (fVar140 + fVar140);
        fVar77 = *(float *)(ray + k * 4 + 0x80);
        fVar65 = *(float *)(ray + k * 4 + 0x30);
        auVar106._0_4_ = -(uint)(fVar139 <= fVar77 && fVar65 <= fVar139) & auVar159._0_4_;
        auVar106._4_4_ = -(uint)(fVar166 <= fVar77 && fVar65 <= fVar166) & auVar159._4_4_;
        auVar106._8_4_ = -(uint)(fVar137 <= fVar77 && fVar65 <= fVar137) & auVar159._8_4_;
        auVar106._12_4_ = -(uint)(fVar138 <= fVar77 && fVar65 <= fVar138) & auVar159._12_4_;
        iVar30 = movmskps(iVar30,auVar106);
        if (iVar30 != 0) {
          aVar107._0_4_ = auVar106._0_4_ & -(uint)(fVar182 != 0.0);
          aVar107._4_4_ = auVar106._4_4_ & -(uint)(fVar153 != 0.0);
          aVar107._8_4_ = auVar106._8_4_ & -(uint)(fVar184 != 0.0);
          aVar107._12_4_ = auVar106._12_4_ & -(uint)(fVar185 != 0.0);
          iVar30 = movmskps(iVar30,(undefined1  [16])aVar107);
          if (iVar30 != 0) {
            uVar52 = pGVar14->_geomID;
            uVar53 = pGVar14->_primID;
            uStack_1290 = auVar147._8_8_;
            tNear.field_0._8_8_ = uStack_1290;
            tNear.field_0._0_8_ = auVar147._0_8_;
            auVar27._4_4_ = fVar193;
            auVar27._0_4_ = fVar191;
            auVar27._8_4_ = fVar195;
            auVar27._12_4_ = fVar197;
            local_1108[0] = fVar139;
            local_1108[1] = fVar166;
            local_1108[2] = fVar137;
            local_1108[3] = fVar138;
            _local_10f8 = auVar83;
            local_10e8[0] = fVar173;
            local_10e8[1] = fVar150;
            local_10e8[2] = fVar174;
            local_10e8[3] = fVar152;
            local_10d8[0] = fVar74;
            local_10d8[1] = fVar75;
            local_10d8[2] = fVar76;
            local_10d8[3] = fVar125;
            pGVar15 = (context->scene->geometries).items[uVar52].ptr;
            pGVar38 = (GridSOA *)(ulong)uVar53;
            if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              uVar54 = *(uint *)(pGVar1->data + uVar33 * 0xc);
              pcVar6 = local_1220 + uVar32 * 4;
              uVar55 = *(uint *)pcVar6;
              uVar56 = *(uint *)(pcVar6 + 4);
              uVar57 = *(uint *)(pGVar1->data + uVar33 * 0xc + 4);
              uVar58 = *(uint *)(pcVar6 + 8);
              if (uVar32 == 2) {
                uVar57 = uVar54;
                uVar58 = uVar56;
              }
              auVar103 = rcpps(auVar27,auVar169);
              fVar65 = auVar103._0_4_;
              fVar74 = auVar103._4_4_;
              fVar75 = auVar103._8_4_;
              fVar76 = auVar103._12_4_;
              fVar65 = (float)(-(uint)(1e-18 <= local_fc8) &
                              (uint)(((float)DAT_01f46a60 - auVar169._0_4_ * fVar65) * fVar65 +
                                    fVar65));
              fVar74 = (float)(-(uint)(1e-18 <= fStack_fc4) &
                              (uint)((DAT_01f46a60._4_4_ - auVar169._4_4_ * fVar74) * fVar74 +
                                    fVar74));
              fVar75 = (float)(-(uint)(1e-18 <= fStack_fc0) &
                              (uint)((DAT_01f46a60._8_4_ - auVar169._8_4_ * fVar75) * fVar75 +
                                    fVar75));
              fVar76 = (float)(-(uint)(1e-18 <= fStack_fbc) &
                              (uint)((DAT_01f46a60._12_4_ - auVar169._12_4_ * fVar76) * fVar76 +
                                    fVar76));
              auVar218._0_4_ = fVar141 * fVar65;
              auVar218._4_4_ = fVar151 * fVar74;
              auVar218._8_4_ = auVar147._8_4_ * fVar75;
              auVar218._12_4_ = auVar147._12_4_ * fVar76;
              auVar99 = minps(auVar218,_DAT_01f46a60);
              auVar170._0_4_ = fVar191 * fVar65;
              auVar170._4_4_ = fVar193 * fVar74;
              auVar170._8_4_ = fVar195 * fVar75;
              auVar170._12_4_ = fVar197 * fVar76;
              auVar103 = minps(auVar170,_DAT_01f46a60);
              fVar140 = auVar99._0_4_;
              fVar173 = auVar99._4_4_;
              fVar150 = auVar99._8_4_;
              fVar174 = auVar99._12_4_;
              fVar125 = auVar103._0_4_;
              fVar141 = auVar103._4_4_;
              fVar151 = auVar103._8_4_;
              fVar181 = auVar103._12_4_;
              fVar65 = ((float)DAT_01f46a60 - fVar140) - fVar125;
              fVar74 = (DAT_01f46a60._4_4_ - fVar173) - fVar141;
              fVar75 = (DAT_01f46a60._8_4_ - fVar150) - fVar151;
              fVar76 = (DAT_01f46a60._12_4_ - fVar174) - fVar181;
              local_1128[0] =
                   (float)(*(uint *)local_1220 & 0xffff) * 0.00012207031 * fVar65 +
                   (float)(uVar55 & 0xffff) * 0.00012207031 * fVar125 +
                   (float)(uVar54 & 0xffff) * 0.00012207031 * fVar140;
              local_1128[1] =
                   (float)(uVar55 & 0xffff) * 0.00012207031 * fVar74 +
                   (float)(uVar56 & 0xffff) * 0.00012207031 * fVar141 +
                   (float)(uVar54 & 0xffff) * 0.00012207031 * fVar173;
              local_1128[2] =
                   (float)(uVar54 & 0xffff) * 0.00012207031 * fVar75 +
                   (float)(uVar56 & 0xffff) * 0.00012207031 * fVar151 +
                   (float)(uVar57 & 0xffff) * 0.00012207031 * fVar150;
              local_1128[3] =
                   (float)(uVar56 & 0xffff) * 0.00012207031 * fVar76 +
                   (float)(uVar58 & 0xffff) * 0.00012207031 * fVar181 +
                   (float)(uVar57 & 0xffff) * 0.00012207031 * fVar174;
              local_1118[0] =
                   fVar65 * (float)(*(uint *)local_1220 >> 0x10) * 0.00012207031 +
                   (float)(uVar55 >> 0x10) * 0.00012207031 * fVar125 +
                   (float)(uVar54 >> 0x10) * 0.00012207031 * fVar140;
              local_1118[1] =
                   fVar74 * (float)(uVar55 >> 0x10) * 0.00012207031 +
                   (float)(uVar56 >> 0x10) * 0.00012207031 * fVar141 +
                   (float)(uVar54 >> 0x10) * 0.00012207031 * fVar173;
              local_1118[2] =
                   fVar75 * (float)(uVar54 >> 0x10) * 0.00012207031 +
                   (float)(uVar56 >> 0x10) * 0.00012207031 * fVar151 +
                   (float)(uVar57 >> 0x10) * 0.00012207031 * fVar150;
              local_1118[3] =
                   fVar76 * (float)(uVar56 >> 0x10) * 0.00012207031 +
                   (float)(uVar58 >> 0x10) * 0.00012207031 * fVar181 +
                   (float)(uVar57 >> 0x10) * 0.00012207031 * fVar174;
              auVar66._0_4_ = (uint)fVar139 & aVar107._0_4_;
              auVar66._4_4_ = (uint)fVar166 & aVar107._4_4_;
              auVar66._8_4_ = (uint)fVar137 & aVar107._8_4_;
              auVar66._12_4_ = (uint)fVar138 & aVar107._12_4_;
              auVar84._0_8_ = CONCAT44(~aVar107._4_4_,~aVar107._0_4_) & 0x7f8000007f800000;
              auVar84._8_4_ = ~aVar107._8_4_ & 0x7f800000;
              auVar84._12_4_ = ~aVar107._12_4_ & 0x7f800000;
              auVar84 = auVar84 | auVar66;
              auVar129._4_4_ = auVar84._0_4_;
              auVar129._0_4_ = auVar84._4_4_;
              auVar129._8_4_ = auVar84._12_4_;
              auVar129._12_4_ = auVar84._8_4_;
              auVar103 = minps(auVar129,auVar84);
              auVar67._0_8_ = auVar103._8_8_;
              auVar67._8_4_ = auVar103._0_4_;
              auVar67._12_4_ = auVar103._4_4_;
              auVar103 = minps(auVar67,auVar103);
              uVar58 = -(uint)(auVar103._0_4_ == auVar84._0_4_);
              uVar59 = -(uint)(auVar103._4_4_ == auVar84._4_4_);
              uVar60 = -(uint)(auVar103._8_4_ == auVar84._8_4_);
              uVar61 = -(uint)(auVar103._12_4_ == auVar84._12_4_);
              auVar85._0_4_ = uVar58 & aVar107._0_4_;
              auVar85._4_4_ = uVar59 & aVar107._4_4_;
              auVar85._8_4_ = uVar60 & aVar107._8_4_;
              auVar85._12_4_ = uVar61 & aVar107._12_4_;
              iVar30 = movmskps((int)local_1220,auVar85);
              uVar54 = 0xffffffff;
              uVar55 = 0xffffffff;
              uVar56 = 0xffffffff;
              uVar57 = 0xffffffff;
              if (iVar30 != 0) {
                uVar54 = uVar58;
                uVar55 = uVar59;
                uVar56 = uVar60;
                uVar57 = uVar61;
              }
              auVar108._0_4_ = aVar107._0_4_ & uVar54;
              auVar108._4_4_ = aVar107._4_4_ & uVar55;
              auVar108._8_4_ = aVar107._8_4_ & uVar56;
              auVar108._12_4_ = aVar107._12_4_ & uVar57;
              uVar40 = movmskps(iVar30,auVar108);
              uVar44 = CONCAT44((int)((ulong)local_1220 >> 0x20),uVar40);
              lVar45 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                }
              }
              valid.field_0 = aVar107;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar65 = local_1128[lVar45];
                fVar77 = local_1118[lVar45];
                fVar76 = local_10e8[lVar45 + -4];
                fVar74 = local_10e8[lVar45];
                fVar75 = local_10d8[lVar45];
                *(float *)(ray + k * 4 + 0x80) = local_1108[lVar45];
                *(float *)(ray + k * 4 + 0xc0) = fVar76;
                *(float *)(ray + k * 4 + 0xd0) = fVar74;
                *(float *)(ray + k * 4 + 0xe0) = fVar75;
                *(float *)(ray + k * 4 + 0xf0) = fVar65;
                *(float *)(ray + k * 4 + 0x100) = fVar77;
                *(uint *)(ray + k * 4 + 0x110) = uVar53;
                *(uint *)(ray + k * 4 + 0x120) = uVar52;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                pGVar38 = (GridSOA *)context;
              }
              else {
                auVar28 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar31);
                uStack_125c = (undefined4)
                              ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar31 + 8) >> 0x20);
                while( true ) {
                  local_1098 = local_1128[lVar45];
                  fVar65 = local_1118[lVar45];
                  *(float *)(ray + k * 4 + 0x80) = local_1108[lVar45];
                  args.context = context->user;
                  local_1088._4_4_ = fVar65;
                  local_1088._0_4_ = fVar65;
                  local_1088._8_4_ = fVar65;
                  local_1088._12_4_ = fVar65;
                  local_10c8 = local_10e8[lVar45 + -4];
                  fVar65 = local_10e8[lVar45];
                  fVar74 = local_10d8[lVar45];
                  local_10b8._4_4_ = fVar65;
                  local_10b8._0_4_ = fVar65;
                  local_10b8._8_4_ = fVar65;
                  local_10b8._12_4_ = fVar65;
                  local_10a8._4_4_ = fVar74;
                  local_10a8._0_4_ = fVar74;
                  local_10a8._8_4_ = fVar74;
                  local_10a8._12_4_ = fVar74;
                  fStack_10c4 = local_10c8;
                  fStack_10c0 = local_10c8;
                  fStack_10bc = local_10c8;
                  fStack_1094 = local_1098;
                  fStack_1090 = local_1098;
                  fStack_108c = local_1098;
                  local_1078 = CONCAT44(uVar53,uVar53);
                  uStack_1070 = CONCAT44(uVar53,uVar53);
                  local_1068 = CONCAT44(uVar52,uVar52);
                  uStack_1060 = CONCAT44(uVar52,uVar52);
                  local_1058 = (args.context)->instID[0];
                  uStack_1054 = local_1058;
                  uStack_1050 = local_1058;
                  uStack_104c = local_1058;
                  local_1048 = (args.context)->instPrimID[0];
                  uStack_1044 = local_1048;
                  uStack_1040 = local_1048;
                  uStack_103c = local_1048;
                  local_1238._12_4_ = uStack_125c;
                  local_1238._0_12_ = auVar28;
                  args.valid = (int *)local_1238;
                  pGVar38 = (GridSOA *)pGVar15->userPtr;
                  args.hit = (RTCHitN *)&local_10c8;
                  args.N = 4;
                  p_Var35 = pGVar15->intersectionFilterN;
                  args.geometryUserPtr = pGVar38;
                  args.ray = (RTCRayN *)ray;
                  if (p_Var35 != (RTCFilterFunctionN)0x0) {
                    p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&args);
                  }
                  auVar89._0_4_ = -(uint)(local_1238._0_4_ == 0);
                  auVar89._4_4_ = -(uint)(local_1238._4_4_ == 0);
                  auVar89._8_4_ = -(uint)(local_1238._8_4_ == 0);
                  auVar89._12_4_ = -(uint)(local_1238._12_4_ == 0);
                  uVar54 = movmskps((int)p_Var35,auVar89);
                  pRVar34 = (RTCRayN *)(ulong)(uVar54 ^ 0xf);
                  if ((uVar54 ^ 0xf) == 0) {
                    auVar89 = auVar89 ^ _DAT_01f46b70;
                  }
                  else {
                    pGVar38 = (GridSOA *)context->args;
                    pcVar36 = *(code **)&pGVar38->height;
                    if ((pcVar36 != (code *)0x0) &&
                       ((((pGVar38->troot).ptr & 2) != 0 ||
                        (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                      pcVar36 = (code *)(*pcVar36)(&args);
                    }
                    auVar70._0_4_ = -(uint)(local_1238._0_4_ == 0);
                    auVar70._4_4_ = -(uint)(local_1238._4_4_ == 0);
                    auVar70._8_4_ = -(uint)(local_1238._8_4_ == 0);
                    auVar70._12_4_ = -(uint)(local_1238._12_4_ == 0);
                    auVar89 = auVar70 ^ _DAT_01f46b70;
                    uVar54 = movmskps((int)pcVar36,auVar70);
                    pRVar34 = (RTCRayN *)(ulong)(uVar54 ^ 0xf);
                    if ((uVar54 ^ 0xf) != 0) {
                      auVar115._0_4_ = *(uint *)(args.ray + 0xc0) & auVar70._0_4_;
                      auVar115._4_4_ = *(uint *)(args.ray + 0xc4) & auVar70._4_4_;
                      auVar115._8_4_ = *(uint *)(args.ray + 200) & auVar70._8_4_;
                      auVar115._12_4_ = *(uint *)(args.ray + 0xcc) & auVar70._12_4_;
                      auVar171._0_4_ = ~auVar70._0_4_ & *(uint *)args.hit;
                      auVar171._4_4_ = ~auVar70._4_4_ & *(uint *)(args.hit + 4);
                      auVar171._8_4_ = ~auVar70._8_4_ & *(uint *)(args.hit + 8);
                      auVar171._12_4_ = ~auVar70._12_4_ & *(uint *)(args.hit + 0xc);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar171 | auVar115;
                      uVar54 = *(uint *)(args.hit + 0x14);
                      uVar55 = *(uint *)(args.hit + 0x18);
                      uVar56 = *(uint *)(args.hit + 0x1c);
                      *(uint *)(args.ray + 0xd0) =
                           ~auVar70._0_4_ & *(uint *)(args.hit + 0x10) |
                           *(uint *)(args.ray + 0xd0) & auVar70._0_4_;
                      *(uint *)(args.ray + 0xd4) =
                           ~auVar70._4_4_ & uVar54 | *(uint *)(args.ray + 0xd4) & auVar70._4_4_;
                      *(uint *)(args.ray + 0xd8) =
                           ~auVar70._8_4_ & uVar55 | *(uint *)(args.ray + 0xd8) & auVar70._8_4_;
                      *(uint *)(args.ray + 0xdc) =
                           ~auVar70._12_4_ & uVar56 | *(uint *)(args.ray + 0xdc) & auVar70._12_4_;
                      auVar148._0_4_ = *(uint *)(args.ray + 0xe0) & auVar70._0_4_;
                      auVar148._4_4_ = *(uint *)(args.ray + 0xe4) & auVar70._4_4_;
                      auVar148._8_4_ = *(uint *)(args.ray + 0xe8) & auVar70._8_4_;
                      auVar148._12_4_ = *(uint *)(args.ray + 0xec) & auVar70._12_4_;
                      auVar116._0_4_ = ~auVar70._0_4_ & *(uint *)(args.hit + 0x20);
                      auVar116._4_4_ = ~auVar70._4_4_ & *(uint *)(args.hit + 0x24);
                      auVar116._8_4_ = ~auVar70._8_4_ & *(uint *)(args.hit + 0x28);
                      auVar116._12_4_ = ~auVar70._12_4_ & *(uint *)(args.hit + 0x2c);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar116 | auVar148;
                      auVar161._0_4_ = *(uint *)(args.ray + 0xf0) & auVar70._0_4_;
                      auVar161._4_4_ = *(uint *)(args.ray + 0xf4) & auVar70._4_4_;
                      auVar161._8_4_ = *(uint *)(args.ray + 0xf8) & auVar70._8_4_;
                      auVar161._12_4_ = *(uint *)(args.ray + 0xfc) & auVar70._12_4_;
                      auVar117._0_4_ = ~auVar70._0_4_ & *(uint *)(args.hit + 0x30);
                      auVar117._4_4_ = ~auVar70._4_4_ & *(uint *)(args.hit + 0x34);
                      auVar117._8_4_ = ~auVar70._8_4_ & *(uint *)(args.hit + 0x38);
                      auVar117._12_4_ = ~auVar70._12_4_ & *(uint *)(args.hit + 0x3c);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar117 | auVar161;
                      uVar54 = *(uint *)(args.hit + 0x44);
                      uVar55 = *(uint *)(args.hit + 0x48);
                      uVar56 = *(uint *)(args.hit + 0x4c);
                      *(uint *)(args.ray + 0x100) =
                           ~auVar70._0_4_ & *(uint *)(args.hit + 0x40) |
                           *(uint *)(args.ray + 0x100) & auVar70._0_4_;
                      *(uint *)(args.ray + 0x104) =
                           ~auVar70._4_4_ & uVar54 | *(uint *)(args.ray + 0x104) & auVar70._4_4_;
                      *(uint *)(args.ray + 0x108) =
                           ~auVar70._8_4_ & uVar55 | *(uint *)(args.ray + 0x108) & auVar70._8_4_;
                      *(uint *)(args.ray + 0x10c) =
                           ~auVar70._12_4_ & uVar56 | *(uint *)(args.ray + 0x10c) & auVar70._12_4_;
                      uVar54 = *(uint *)(args.hit + 0x54);
                      uVar55 = *(uint *)(args.hit + 0x58);
                      uVar56 = *(uint *)(args.hit + 0x5c);
                      *(uint *)(args.ray + 0x110) =
                           *(uint *)(args.ray + 0x110) & auVar70._0_4_ |
                           ~auVar70._0_4_ & *(uint *)(args.hit + 0x50);
                      *(uint *)(args.ray + 0x114) =
                           *(uint *)(args.ray + 0x114) & auVar70._4_4_ | ~auVar70._4_4_ & uVar54;
                      *(uint *)(args.ray + 0x118) =
                           *(uint *)(args.ray + 0x118) & auVar70._8_4_ | ~auVar70._8_4_ & uVar55;
                      *(uint *)(args.ray + 0x11c) =
                           *(uint *)(args.ray + 0x11c) & auVar70._12_4_ | ~auVar70._12_4_ & uVar56;
                      uVar54 = *(uint *)(args.hit + 100);
                      uVar55 = *(uint *)(args.hit + 0x68);
                      uVar56 = *(uint *)(args.hit + 0x6c);
                      *(uint *)(args.ray + 0x120) =
                           *(uint *)(args.ray + 0x120) & auVar70._0_4_ |
                           ~auVar70._0_4_ & *(uint *)(args.hit + 0x60);
                      *(uint *)(args.ray + 0x124) =
                           *(uint *)(args.ray + 0x124) & auVar70._4_4_ | ~auVar70._4_4_ & uVar54;
                      *(uint *)(args.ray + 0x128) =
                           *(uint *)(args.ray + 0x128) & auVar70._8_4_ | ~auVar70._8_4_ & uVar55;
                      *(uint *)(args.ray + 300) =
                           *(uint *)(args.ray + 300) & auVar70._12_4_ | ~auVar70._12_4_ & uVar56;
                      auVar118._0_4_ = *(uint *)(args.ray + 0x130) & auVar70._0_4_;
                      auVar118._4_4_ = *(uint *)(args.ray + 0x134) & auVar70._4_4_;
                      auVar118._8_4_ = *(uint *)(args.ray + 0x138) & auVar70._8_4_;
                      auVar118._12_4_ = *(uint *)(args.ray + 0x13c) & auVar70._12_4_;
                      auVar133._0_4_ = ~auVar70._0_4_ & *(uint *)(args.hit + 0x70);
                      auVar133._4_4_ = ~auVar70._4_4_ & *(uint *)(args.hit + 0x74);
                      auVar133._8_4_ = ~auVar70._8_4_ & *(uint *)(args.hit + 0x78);
                      auVar133._12_4_ = ~auVar70._12_4_ & *(uint *)(args.hit + 0x7c);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar133 | auVar118;
                      *(undefined1 (*) [16])(args.ray + 0x140) =
                           ~auVar70 & *(undefined1 (*) [16])(args.hit + 0x80) |
                           *(undefined1 (*) [16])(args.ray + 0x140) & auVar70;
                      pRVar34 = args.ray;
                      pGVar38 = (GridSOA *)args.hit;
                    }
                  }
                  auVar90._0_4_ = auVar89._0_4_ << 0x1f;
                  auVar90._4_4_ = auVar89._4_4_ << 0x1f;
                  auVar90._8_4_ = auVar89._8_4_ << 0x1f;
                  auVar90._12_4_ = auVar89._12_4_ << 0x1f;
                  iVar30 = movmskps((int)pRVar34,auVar90);
                  if (iVar30 == 0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar77;
                  }
                  else {
                    fVar77 = *(float *)(ray + k * 4 + 0x80);
                  }
                  *(undefined4 *)(local_1238 + lVar45 * 4 + -0x10) = 0;
                  valid.field_0.i[0] = -(uint)(fVar139 <= fVar77) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(fVar166 <= fVar77) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(fVar137 <= fVar77) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(fVar138 <= fVar77) & valid.field_0.i[3];
                  iVar30 = movmskps(iVar30,(undefined1  [16])valid.field_0);
                  if (iVar30 == 0) break;
                  auVar91._0_4_ = valid.field_0.i[0] & (uint)fVar139;
                  auVar91._4_4_ = valid.field_0.i[1] & (uint)fVar166;
                  auVar91._8_4_ = valid.field_0.i[2] & (uint)fVar137;
                  auVar91._12_4_ = valid.field_0.i[3] & (uint)fVar138;
                  auVar119._0_8_ =
                       CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                  auVar119._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                  auVar119._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                  auVar119 = auVar119 | auVar91;
                  auVar134._4_4_ = auVar119._0_4_;
                  auVar134._0_4_ = auVar119._4_4_;
                  auVar134._8_4_ = auVar119._12_4_;
                  auVar134._12_4_ = auVar119._8_4_;
                  auVar103 = minps(auVar134,auVar119);
                  auVar92._0_8_ = auVar103._8_8_;
                  auVar92._8_4_ = auVar103._0_4_;
                  auVar92._12_4_ = auVar103._4_4_;
                  auVar103 = minps(auVar92,auVar103);
                  auVar93._0_8_ =
                       CONCAT44(-(uint)(auVar103._4_4_ == auVar119._4_4_) & valid.field_0.i[1],
                                -(uint)(auVar103._0_4_ == auVar119._0_4_) & valid.field_0.i[0]);
                  auVar93._8_4_ = -(uint)(auVar103._8_4_ == auVar119._8_4_) & valid.field_0.i[2];
                  auVar93._12_4_ = -(uint)(auVar103._12_4_ == auVar119._12_4_) & valid.field_0.i[3];
                  iVar30 = movmskps(iVar30,auVar93);
                  aVar71 = valid.field_0;
                  if (iVar30 != 0) {
                    aVar71.i[2] = auVar93._8_4_;
                    aVar71._0_8_ = auVar93._0_8_;
                    aVar71.i[3] = auVar93._12_4_;
                  }
                  uVar40 = movmskps(iVar30,(undefined1  [16])aVar71);
                  uVar44 = CONCAT44((int)((ulong)pRVar34 >> 0x20),uVar40);
                  lVar45 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (2 < uVar37) {
        pcVar39 = pGVar1->data + uVar32 * 4 + -4;
        fVar65 = *(float *)(pGVar1->data + uVar32 * 4);
        pcVar6 = pcVar39 + uVar32 * 4;
        fVar77 = *(float *)(pcVar6 + 4);
        fVar74 = *(float *)(pGVar1->data + uVar32 * 4 + 4);
        fVar75 = *(float *)(pcVar6 + 8);
        if (uVar32 == 2) {
          fVar74 = fVar65;
          fVar75 = fVar77;
        }
        pGVar14 = (local_1228->super_Precalculations).grid;
        uVar44 = (ulong)pGVar14->dim_offset;
        pcVar2 = pcVar39 + uVar44 * 4;
        fVar76 = *(float *)(pcVar2 + 4);
        pcVar47 = pcVar2 + uVar32 * 4;
        fVar125 = *(float *)(pcVar47 + 4);
        fVar137 = *(float *)(pcVar2 + 8);
        fVar138 = *(float *)(pcVar47 + 8);
        if (uVar32 == 2) {
          fVar137 = fVar76;
          fVar138 = fVar125;
        }
        pcVar3 = pcVar39 + uVar44 * 8;
        fVar139 = *(float *)(pcVar3 + 4);
        pcVar42 = pcVar3 + uVar32 * 4;
        fVar141 = *(float *)(pcVar42 + 4);
        fVar151 = *(float *)(pcVar42 + 8);
        fVar166 = *(float *)(pcVar3 + 8);
        if (uVar32 == 2) {
          fVar151 = fVar141;
          fVar166 = fVar139;
        }
        uVar33 = (ulong)(pGVar14->gridBytes & 0xfffffffc);
        pcVar7 = pcVar39 + uVar33;
        fVar181 = *(float *)(pcVar7 + 4);
        pcVar8 = pcVar39 + uVar32 * 4 + uVar33;
        fVar140 = *(float *)(pcVar8 + 4);
        fVar173 = *(float *)(pcVar7 + 8);
        fVar150 = *(float *)(pcVar8 + 8);
        if (uVar32 == 2) {
          fVar173 = fVar181;
          fVar150 = fVar140;
        }
        pcVar48 = pcVar2 + uVar33;
        fVar174 = *(float *)(pcVar48 + 4);
        pcVar4 = pcVar48 + uVar32 * 4;
        fVar152 = *(float *)(pcVar4 + 4);
        fVar182 = *(float *)(pcVar48 + 8);
        fVar153 = *(float *)(pcVar4 + 8);
        if (uVar32 == 2) {
          fVar182 = fVar174;
          fVar153 = fVar152;
        }
        pcVar43 = pcVar3 + uVar33;
        fVar184 = *(float *)(pcVar43 + 4);
        pcVar5 = pcVar43 + uVar32 * 4;
        fVar185 = *(float *)(pcVar5 + 4);
        fVar176 = *(float *)(pcVar43 + 8);
        fVar186 = *(float *)(pcVar5 + 8);
        if (uVar32 == 2) {
          fVar176 = fVar184;
          fVar186 = fVar185;
        }
        local_1220 = pcVar39 + uVar44 * 0xc;
        fVar180 = *(float *)(ray + k * 4);
        fVar175 = *(float *)(ray + k * 4 + 0x10);
        fVar216 = *(float *)(ray + k * 4 + 0x20);
        fVar11 = *(float *)(ray + k * 4 + 0x40);
        fVar154 = *(float *)(ray + k * 4 + 0x50);
        fVar163 = (*(float *)pcVar39 * fVar217 + *(float *)pcVar7 * fVar64) - fVar180;
        fVar164 = (*(float *)pcVar6 * fVar217 + *(float *)pcVar8 * fVar64) - fVar180;
        fVar165 = (fVar65 * fVar217 + fVar181 * fVar64) - fVar180;
        fVar178 = (fVar77 * fVar217 + fVar140 * fVar64) - fVar180;
        fVar201 = (*(float *)pcVar2 * fVar217 + *(float *)pcVar48 * fVar64) - fVar175;
        fVar202 = (*(float *)pcVar47 * fVar217 + *(float *)pcVar4 * fVar64) - fVar175;
        fVar203 = (fVar76 * fVar217 + fVar174 * fVar64) - fVar175;
        fVar204 = (fVar125 * fVar217 + fVar152 * fVar64) - fVar175;
        fVar205 = (*(float *)pcVar3 * fVar217 + *(float *)pcVar43 * fVar64) - fVar216;
        fVar208 = (*(float *)pcVar42 * fVar217 + *(float *)pcVar5 * fVar64) - fVar216;
        fVar210 = (fVar139 * fVar217 + fVar184 * fVar64) - fVar216;
        fVar212 = (fVar141 * fVar217 + fVar185 * fVar64) - fVar216;
        fVar179 = (fVar65 * fVar217 + fVar181 * fVar64) - fVar180;
        fVar187 = (fVar65 * fVar217 + fVar181 * fVar64) - fVar180;
        fVar188 = (fVar74 * fVar217 + fVar173 * fVar64) - fVar180;
        fVar189 = (fVar74 * fVar217 + fVar173 * fVar64) - fVar180;
        fVar228 = (fVar76 * fVar217 + fVar174 * fVar64) - fVar175;
        fVar232 = (fVar76 * fVar217 + fVar174 * fVar64) - fVar175;
        fVar236 = (fVar137 * fVar217 + fVar182 * fVar64) - fVar175;
        fVar240 = (fVar137 * fVar217 + fVar182 * fVar64) - fVar175;
        fVar190 = (fVar139 * fVar217 + fVar184 * fVar64) - fVar216;
        fVar191 = (fVar139 * fVar217 + fVar184 * fVar64) - fVar216;
        fVar192 = (fVar166 * fVar217 + fVar176 * fVar64) - fVar216;
        fVar194 = (fVar166 * fVar217 + fVar176 * fVar64) - fVar216;
        fVar196 = (*(float *)pcVar6 * fVar217 + *(float *)pcVar8 * fVar64) - fVar180;
        fVar197 = (fVar77 * fVar217 + fVar140 * fVar64) - fVar180;
        fVar198 = (fVar77 * fVar217 + fVar140 * fVar64) - fVar180;
        fVar180 = (fVar75 * fVar217 + fVar150 * fVar64) - fVar180;
        fVar77 = (*(float *)pcVar47 * fVar217 + *(float *)pcVar4 * fVar64) - fVar175;
        fVar182 = (fVar125 * fVar217 + fVar152 * fVar64) - fVar175;
        fVar184 = (fVar125 * fVar217 + fVar152 * fVar64) - fVar175;
        fVar175 = (fVar138 * fVar217 + fVar153 * fVar64) - fVar175;
        fVar221 = (*(float *)pcVar42 * fVar217 + *(float *)pcVar5 * fVar64) - fVar216;
        fVar223 = (fVar141 * fVar217 + fVar185 * fVar64) - fVar216;
        fVar225 = (fVar141 * fVar217 + fVar185 * fVar64) - fVar216;
        fVar216 = (fVar151 * fVar217 + fVar186 * fVar64) - fVar216;
        fVar151 = fVar196 - fVar163;
        fVar181 = fVar197 - fVar164;
        fVar173 = fVar198 - fVar165;
        fVar174 = fVar180 - fVar178;
        fVar74 = fVar77 - fVar201;
        fVar76 = fVar182 - fVar202;
        fVar137 = fVar184 - fVar203;
        fVar139 = fVar175 - fVar204;
        fVar214 = fVar221 - fVar205;
        fVar220 = fVar223 - fVar208;
        fVar226 = fVar225 - fVar210;
        fVar235 = fVar216 - fVar212;
        fVar65 = *(float *)(ray + k * 4 + 0x60);
        fVar166 = fVar163 - fVar179;
        fVar140 = fVar164 - fVar187;
        fVar150 = fVar165 - fVar188;
        fVar152 = fVar178 - fVar189;
        fVar229 = fVar201 - fVar228;
        fVar233 = fVar202 - fVar232;
        fVar237 = fVar203 - fVar236;
        fVar241 = fVar204 - fVar240;
        fVar153 = (fVar74 * (fVar221 + fVar205) - (fVar77 + fVar201) * fVar214) * fVar11 +
                  ((fVar196 + fVar163) * fVar214 - (fVar221 + fVar205) * fVar151) * fVar154 +
                  (fVar151 * (fVar77 + fVar201) - (fVar196 + fVar163) * fVar74) * fVar65;
        fVar185 = (fVar76 * (fVar223 + fVar208) - (fVar182 + fVar202) * fVar220) * fVar11 +
                  ((fVar197 + fVar164) * fVar220 - (fVar223 + fVar208) * fVar181) * fVar154 +
                  (fVar181 * (fVar182 + fVar202) - (fVar197 + fVar164) * fVar76) * fVar65;
        auVar177._0_8_ = CONCAT44(fVar185,fVar153);
        auVar177._8_4_ =
             (fVar137 * (fVar225 + fVar210) - (fVar184 + fVar203) * fVar226) * fVar11 +
             ((fVar198 + fVar165) * fVar226 - (fVar225 + fVar210) * fVar173) * fVar154 +
             (fVar173 * (fVar184 + fVar203) - (fVar198 + fVar165) * fVar137) * fVar65;
        auVar177._12_4_ =
             (fVar139 * (fVar216 + fVar212) - (fVar175 + fVar204) * fVar235) * fVar11 +
             ((fVar180 + fVar178) * fVar235 - (fVar216 + fVar212) * fVar174) * fVar154 +
             (fVar174 * (fVar175 + fVar204) - (fVar180 + fVar178) * fVar139) * fVar65;
        fVar215 = fVar205 - fVar190;
        fVar222 = fVar208 - fVar191;
        fVar227 = fVar210 - fVar192;
        fVar239 = fVar212 - fVar194;
        fVar207 = (fVar229 * (fVar205 + fVar190) - (fVar201 + fVar228) * fVar215) * fVar11 +
                  ((fVar163 + fVar179) * fVar215 - (fVar205 + fVar190) * fVar166) * fVar154 +
                  (fVar166 * (fVar201 + fVar228) - (fVar163 + fVar179) * fVar229) * fVar65;
        fVar209 = (fVar233 * (fVar208 + fVar191) - (fVar202 + fVar232) * fVar222) * fVar11 +
                  ((fVar164 + fVar187) * fVar222 - (fVar208 + fVar191) * fVar140) * fVar154 +
                  (fVar140 * (fVar202 + fVar232) - (fVar164 + fVar187) * fVar233) * fVar65;
        fVar211 = (fVar237 * (fVar210 + fVar192) - (fVar203 + fVar236) * fVar227) * fVar11 +
                  ((fVar165 + fVar188) * fVar227 - (fVar210 + fVar192) * fVar150) * fVar154 +
                  (fVar150 * (fVar203 + fVar236) - (fVar165 + fVar188) * fVar237) * fVar65;
        fVar213 = (fVar241 * (fVar212 + fVar194) - (fVar204 + fVar240) * fVar239) * fVar11 +
                  ((fVar178 + fVar189) * fVar239 - (fVar212 + fVar194) * fVar152) * fVar154 +
                  (fVar152 * (fVar204 + fVar240) - (fVar178 + fVar189) * fVar241) * fVar65;
        fVar217 = fVar179 - fVar196;
        fVar224 = fVar187 - fVar197;
        fVar231 = fVar188 - fVar198;
        fVar219 = fVar189 - fVar180;
        fVar75 = fVar228 - fVar77;
        fVar125 = fVar232 - fVar182;
        fVar138 = fVar236 - fVar184;
        fVar141 = fVar240 - fVar175;
        fVar176 = fVar190 - fVar221;
        fVar186 = fVar191 - fVar223;
        fVar193 = fVar192 - fVar225;
        fVar195 = fVar194 - fVar216;
        auVar86._0_4_ =
             (fVar75 * (fVar221 + fVar190) - (fVar77 + fVar228) * fVar176) * fVar11 +
             ((fVar196 + fVar179) * fVar176 - (fVar221 + fVar190) * fVar217) * fVar154 +
             (fVar217 * (fVar77 + fVar228) - (fVar196 + fVar179) * fVar75) * fVar65;
        auVar86._4_4_ =
             (fVar125 * (fVar223 + fVar191) - (fVar182 + fVar232) * fVar186) * fVar11 +
             ((fVar197 + fVar187) * fVar186 - (fVar223 + fVar191) * fVar224) * fVar154 +
             (fVar224 * (fVar182 + fVar232) - (fVar197 + fVar187) * fVar125) * fVar65;
        auVar86._8_4_ =
             (fVar138 * (fVar225 + fVar192) - (fVar184 + fVar236) * fVar193) * fVar11 +
             ((fVar198 + fVar188) * fVar193 - (fVar225 + fVar192) * fVar231) * fVar154 +
             (fVar231 * (fVar184 + fVar236) - (fVar198 + fVar188) * fVar138) * fVar65;
        auVar86._12_4_ =
             (fVar141 * (fVar216 + fVar194) - (fVar175 + fVar240) * fVar195) * fVar11 +
             ((fVar180 + fVar189) * fVar195 - (fVar216 + fVar194) * fVar219) * fVar154 +
             (fVar219 * (fVar175 + fVar240) - (fVar180 + fVar189) * fVar141) * fVar65;
        auVar130._0_4_ = fVar153 + fVar207 + auVar86._0_4_;
        auVar130._4_4_ = fVar185 + fVar209 + auVar86._4_4_;
        auVar130._8_4_ = auVar177._8_4_ + fVar211 + auVar86._8_4_;
        auVar130._12_4_ = auVar177._12_4_ + fVar213 + auVar86._12_4_;
        auVar109._8_4_ = auVar177._8_4_;
        auVar109._0_8_ = auVar177._0_8_;
        auVar109._12_4_ = auVar177._12_4_;
        auVar23._4_4_ = fVar209;
        auVar23._0_4_ = fVar207;
        auVar23._8_4_ = fVar211;
        auVar23._12_4_ = fVar213;
        auVar103 = minps(auVar109,auVar23);
        auVar103 = minps(auVar103,auVar86);
        auVar199._8_4_ = auVar177._8_4_;
        auVar199._0_8_ = auVar177._0_8_;
        auVar199._12_4_ = auVar177._12_4_;
        auVar24._4_4_ = fVar209;
        auVar24._0_4_ = fVar207;
        auVar24._8_4_ = fVar211;
        auVar24._12_4_ = fVar213;
        auVar99 = maxps(auVar199,auVar24);
        auVar99 = maxps(auVar99,auVar86);
        local_11d8 = CONCAT44(auVar130._4_4_,auVar130._0_4_);
        local_11d8 = local_11d8 & 0x7fffffff7fffffff;
        fVar64 = ABS(auVar130._8_4_) * 1.1920929e-07;
        fVar77 = ABS(auVar130._12_4_) * 1.1920929e-07;
        auVar200._4_4_ = -(uint)(auVar99._4_4_ <= ABS(auVar130._4_4_) * 1.1920929e-07);
        auVar200._0_4_ = -(uint)(auVar99._0_4_ <= ABS(auVar130._0_4_) * 1.1920929e-07);
        auVar200._8_4_ = -(uint)(auVar99._8_4_ <= fVar64);
        auVar200._12_4_ = -(uint)(auVar99._12_4_ <= fVar77);
        auVar110._4_4_ = -(uint)(-(ABS(auVar130._4_4_) * 1.1920929e-07) <= auVar103._4_4_);
        auVar110._0_4_ = -(uint)(-(ABS(auVar130._0_4_) * 1.1920929e-07) <= auVar103._0_4_);
        auVar110._8_4_ = -(uint)(-fVar64 <= auVar103._8_4_);
        auVar110._12_4_ = -(uint)(-fVar77 <= auVar103._12_4_);
        auVar200 = auVar200 | auVar110;
        uVar37 = movmskps(uVar37,auVar200);
        pGVar38 = (GridSOA *)(ulong)uVar37;
        local_1218 = uVar32;
        local_1210 = uVar41;
        if (uVar37 != 0) {
          uVar52 = -(uint)(ABS(fVar75 * fVar215) <= ABS(fVar229 * fVar214));
          uVar55 = -(uint)(ABS(fVar125 * fVar222) <= ABS(fVar233 * fVar220));
          uVar58 = -(uint)(ABS(fVar138 * fVar227) <= ABS(fVar237 * fVar226));
          uVar61 = -(uint)(ABS(fVar141 * fVar239) <= ABS(fVar241 * fVar235));
          uVar53 = -(uint)(ABS(fVar166 * fVar176) <= ABS(fVar151 * fVar215));
          uVar56 = -(uint)(ABS(fVar140 * fVar186) <= ABS(fVar181 * fVar222));
          uVar59 = -(uint)(ABS(fVar150 * fVar193) <= ABS(fVar173 * fVar227));
          uVar62 = -(uint)(ABS(fVar152 * fVar195) <= ABS(fVar174 * fVar239));
          uVar54 = -(uint)(ABS(fVar217 * fVar229) <= ABS(fVar166 * fVar74));
          uVar57 = -(uint)(ABS(fVar224 * fVar233) <= ABS(fVar140 * fVar76));
          uVar60 = -(uint)(ABS(fVar231 * fVar237) <= ABS(fVar150 * fVar137));
          uVar63 = -(uint)(ABS(fVar219 * fVar241) <= ABS(fVar152 * fVar139));
          fVar182 = (float)(~uVar52 & (uint)(fVar74 * fVar215 - fVar229 * fVar214) |
                           (uint)(fVar229 * fVar176 - fVar75 * fVar215) & uVar52);
          fVar184 = (float)(~uVar55 & (uint)(fVar76 * fVar222 - fVar233 * fVar220) |
                           (uint)(fVar233 * fVar186 - fVar125 * fVar222) & uVar55);
          fVar180 = (float)(~uVar58 & (uint)(fVar137 * fVar227 - fVar237 * fVar226) |
                           (uint)(fVar237 * fVar193 - fVar138 * fVar227) & uVar58);
          fVar175 = (float)(~uVar61 & (uint)(fVar139 * fVar239 - fVar241 * fVar235) |
                           (uint)(fVar241 * fVar195 - fVar141 * fVar239) & uVar61);
          fVar176 = (float)(~uVar53 & (uint)(fVar214 * fVar166 - fVar151 * fVar215) |
                           (uint)(fVar217 * fVar215 - fVar166 * fVar176) & uVar53);
          fVar186 = (float)(~uVar56 & (uint)(fVar220 * fVar140 - fVar181 * fVar222) |
                           (uint)(fVar224 * fVar222 - fVar140 * fVar186) & uVar56);
          fVar216 = (float)(~uVar59 & (uint)(fVar226 * fVar150 - fVar173 * fVar227) |
                           (uint)(fVar231 * fVar227 - fVar150 * fVar193) & uVar59);
          fVar179 = (float)(~uVar62 & (uint)(fVar235 * fVar152 - fVar174 * fVar239) |
                           (uint)(fVar219 * fVar239 - fVar152 * fVar195) & uVar62);
          fVar77 = (float)(~uVar54 & (uint)(fVar151 * fVar229 - fVar166 * fVar74) |
                          (uint)(fVar166 * fVar75 - fVar217 * fVar229) & uVar54);
          fVar74 = (float)(~uVar57 & (uint)(fVar181 * fVar233 - fVar140 * fVar76) |
                          (uint)(fVar140 * fVar125 - fVar224 * fVar233) & uVar57);
          fVar75 = (float)(~uVar60 & (uint)(fVar173 * fVar237 - fVar150 * fVar137) |
                          (uint)(fVar150 * fVar138 - fVar231 * fVar237) & uVar60);
          fVar76 = (float)(~uVar63 & (uint)(fVar174 * fVar241 - fVar152 * fVar139) |
                          (uint)(fVar152 * fVar141 - fVar219 * fVar241) & uVar63);
          fVar64 = fVar11 * fVar182 + fVar154 * fVar176 + fVar65 * fVar77;
          fVar125 = fVar11 * fVar184 + fVar154 * fVar186 + fVar65 * fVar74;
          fVar137 = fVar11 * fVar180 + fVar154 * fVar216 + fVar65 * fVar75;
          fVar65 = fVar11 * fVar175 + fVar154 * fVar179 + fVar65 * fVar76;
          auVar131._0_4_ = fVar64 + fVar64;
          auVar131._4_4_ = fVar125 + fVar125;
          auVar131._8_4_ = fVar137 + fVar137;
          auVar131._12_4_ = fVar65 + fVar65;
          auVar111._0_4_ = fVar205 * fVar77;
          auVar111._4_4_ = fVar208 * fVar74;
          auVar111._8_4_ = fVar210 * fVar75;
          auVar111._12_4_ = fVar212 * fVar76;
          fVar138 = fVar163 * fVar182 + fVar201 * fVar176 + auVar111._0_4_;
          fVar139 = fVar164 * fVar184 + fVar202 * fVar186 + auVar111._4_4_;
          fVar141 = fVar165 * fVar180 + fVar203 * fVar216 + auVar111._8_4_;
          fVar151 = fVar178 * fVar175 + fVar204 * fVar179 + auVar111._12_4_;
          auVar103 = rcpps(auVar111,auVar131);
          fVar65 = auVar103._0_4_;
          fVar64 = auVar103._4_4_;
          fVar125 = auVar103._8_4_;
          fVar137 = auVar103._12_4_;
          fVar138 = ((1.0 - auVar131._0_4_ * fVar65) * fVar65 + fVar65) * (fVar138 + fVar138);
          fVar139 = ((1.0 - auVar131._4_4_ * fVar64) * fVar64 + fVar64) * (fVar139 + fVar139);
          fVar125 = ((1.0 - auVar131._8_4_ * fVar125) * fVar125 + fVar125) * (fVar141 + fVar141);
          fVar137 = ((1.0 - auVar131._12_4_ * fVar137) * fVar137 + fVar137) * (fVar151 + fVar151);
          fVar64 = *(float *)(ray + k * 4 + 0x80);
          fVar65 = *(float *)(ray + k * 4 + 0x30);
          auVar112._0_4_ = -(uint)(fVar138 <= fVar64 && fVar65 <= fVar138) & auVar200._0_4_;
          auVar112._4_4_ = -(uint)(fVar139 <= fVar64 && fVar65 <= fVar139) & auVar200._4_4_;
          auVar112._8_4_ = -(uint)(fVar125 <= fVar64 && fVar65 <= fVar125) & auVar200._8_4_;
          auVar112._12_4_ = -(uint)(fVar137 <= fVar64 && fVar65 <= fVar137) & auVar200._12_4_;
          uVar37 = movmskps(uVar37,auVar112);
          pGVar38 = (GridSOA *)(ulong)uVar37;
          if (uVar37 != 0) {
            aVar113._0_4_ = auVar112._0_4_ & -(uint)(auVar131._0_4_ != 0.0);
            aVar113._4_4_ = auVar112._4_4_ & -(uint)(auVar131._4_4_ != 0.0);
            aVar113._8_4_ = auVar112._8_4_ & -(uint)(auVar131._8_4_ != 0.0);
            aVar113._12_4_ = auVar112._12_4_ & -(uint)(auVar131._12_4_ != 0.0);
            uVar37 = movmskps(uVar37,(undefined1  [16])aVar113);
            pGVar38 = (GridSOA *)(ulong)uVar37;
            if (uVar37 != 0) {
              uStack_1250._0_4_ = pGVar14->_geomID;
              uVar37 = pGVar14->_primID;
              uStack_12f0 = auVar177._8_8_;
              tNear.field_0._8_8_ = uStack_12f0;
              tNear.field_0._0_8_ = auVar177._0_8_;
              auVar26._4_4_ = fVar209;
              auVar26._0_4_ = fVar207;
              auVar26._8_4_ = fVar211;
              auVar26._12_4_ = fVar213;
              local_1108[0] = fVar138;
              local_1108[1] = fVar139;
              local_1108[2] = fVar125;
              local_1108[3] = fVar137;
              local_10f8._4_4_ = fVar184;
              local_10f8._0_4_ = fVar182;
              fStack_10f0 = fVar180;
              fStack_10ec = fVar175;
              local_10e8[0] = fVar176;
              local_10e8[1] = fVar186;
              local_10e8[2] = fVar216;
              local_10e8[3] = fVar179;
              local_10d8[0] = fVar77;
              local_10d8[1] = fVar74;
              local_10d8[2] = fVar75;
              local_10d8[3] = fVar76;
              pGVar15 = (context->scene->geometries).items[(long)(ulong)(uint)uStack_1250].ptr;
              pGVar38 = (GridSOA *)(ulong)(uint)uStack_1250;
              if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                uVar52 = *(uint *)(local_1220 + 4);
                pcVar6 = local_1220 + uVar32 * 4;
                uVar53 = *(uint *)pcVar6;
                uVar54 = *(uint *)(pcVar6 + 4);
                uVar55 = *(uint *)(local_1220 + 8);
                uVar56 = *(uint *)(pcVar6 + 8);
                if (uVar32 == 2) {
                  uVar55 = uVar52;
                  uVar56 = uVar54;
                }
                auVar103 = rcpps(auVar26,auVar130);
                fVar65 = auVar103._0_4_;
                fVar77 = auVar103._4_4_;
                fVar74 = auVar103._8_4_;
                fVar75 = auVar103._12_4_;
                fVar65 = (float)(-(uint)(1e-18 <= (float)local_11d8) &
                                (uint)(((float)DAT_01f46a60 - auVar130._0_4_ * fVar65) * fVar65 +
                                      fVar65));
                fVar77 = (float)(-(uint)(1e-18 <= local_11d8._4_4_) &
                                (uint)((DAT_01f46a60._4_4_ - auVar130._4_4_ * fVar77) * fVar77 +
                                      fVar77));
                fVar74 = (float)(-(uint)(1e-18 <= ABS(auVar130._8_4_)) &
                                (uint)((DAT_01f46a60._8_4_ - auVar130._8_4_ * fVar74) * fVar74 +
                                      fVar74));
                fVar75 = (float)(-(uint)(1e-18 <= ABS(auVar130._12_4_)) &
                                (uint)((DAT_01f46a60._12_4_ - auVar130._12_4_ * fVar75) * fVar75 +
                                      fVar75));
                auVar206._0_4_ = fVar153 * fVar65;
                auVar206._4_4_ = fVar185 * fVar77;
                auVar206._8_4_ = auVar177._8_4_ * fVar74;
                auVar206._12_4_ = auVar177._12_4_ * fVar75;
                auVar99 = minps(auVar206,_DAT_01f46a60);
                auVar160._0_4_ = fVar207 * fVar65;
                auVar160._4_4_ = fVar209 * fVar77;
                auVar160._8_4_ = fVar211 * fVar74;
                auVar160._12_4_ = fVar213 * fVar75;
                auVar103 = minps(auVar160,_DAT_01f46a60);
                fVar181 = auVar99._0_4_;
                fVar140 = auVar99._4_4_;
                fVar173 = auVar99._8_4_;
                fVar150 = auVar99._12_4_;
                fVar76 = auVar103._0_4_;
                fVar141 = auVar103._4_4_;
                fVar151 = auVar103._8_4_;
                fVar166 = auVar103._12_4_;
                fVar65 = ((float)DAT_01f46a60 - fVar181) - fVar76;
                fVar77 = (DAT_01f46a60._4_4_ - fVar140) - fVar141;
                fVar74 = (DAT_01f46a60._8_4_ - fVar173) - fVar151;
                fVar75 = (DAT_01f46a60._12_4_ - fVar150) - fVar166;
                local_1128[0] =
                     (float)(*(uint *)local_1220 & 0xffff) * 0.00012207031 * fVar65 +
                     (float)(uVar53 & 0xffff) * 0.00012207031 * fVar76 +
                     (float)(uVar52 & 0xffff) * 0.00012207031 * fVar181;
                local_1128[1] =
                     (float)(uVar53 & 0xffff) * 0.00012207031 * fVar77 +
                     (float)(uVar54 & 0xffff) * 0.00012207031 * fVar141 +
                     (float)(uVar52 & 0xffff) * 0.00012207031 * fVar140;
                local_1128[2] =
                     (float)(uVar52 & 0xffff) * 0.00012207031 * fVar74 +
                     (float)(uVar54 & 0xffff) * 0.00012207031 * fVar151 +
                     (float)(uVar55 & 0xffff) * 0.00012207031 * fVar173;
                local_1128[3] =
                     (float)(uVar54 & 0xffff) * 0.00012207031 * fVar75 +
                     (float)(uVar56 & 0xffff) * 0.00012207031 * fVar166 +
                     (float)(uVar55 & 0xffff) * 0.00012207031 * fVar150;
                local_1118[0] =
                     fVar65 * (float)(*(uint *)local_1220 >> 0x10) * 0.00012207031 +
                     (float)(uVar53 >> 0x10) * 0.00012207031 * fVar76 +
                     (float)(uVar52 >> 0x10) * 0.00012207031 * fVar181;
                local_1118[1] =
                     fVar77 * (float)(uVar53 >> 0x10) * 0.00012207031 +
                     (float)(uVar54 >> 0x10) * 0.00012207031 * fVar141 +
                     (float)(uVar52 >> 0x10) * 0.00012207031 * fVar140;
                local_1118[2] =
                     fVar74 * (float)(uVar52 >> 0x10) * 0.00012207031 +
                     (float)(uVar54 >> 0x10) * 0.00012207031 * fVar151 +
                     (float)(uVar55 >> 0x10) * 0.00012207031 * fVar173;
                local_1118[3] =
                     fVar75 * (float)(uVar54 >> 0x10) * 0.00012207031 +
                     (float)(uVar56 >> 0x10) * 0.00012207031 * fVar166 +
                     (float)(uVar55 >> 0x10) * 0.00012207031 * fVar150;
                auVar68._0_4_ = (uint)fVar138 & aVar113._0_4_;
                auVar68._4_4_ = (uint)fVar139 & aVar113._4_4_;
                auVar68._8_4_ = (uint)fVar125 & aVar113._8_4_;
                auVar68._12_4_ = (uint)fVar137 & aVar113._12_4_;
                auVar87._0_8_ = CONCAT44(~aVar113._4_4_,~aVar113._0_4_) & 0x7f8000007f800000;
                auVar87._8_4_ = ~aVar113._8_4_ & 0x7f800000;
                auVar87._12_4_ = ~aVar113._12_4_ & 0x7f800000;
                auVar87 = auVar87 | auVar68;
                auVar132._4_4_ = auVar87._0_4_;
                auVar132._0_4_ = auVar87._4_4_;
                auVar132._8_4_ = auVar87._12_4_;
                auVar132._12_4_ = auVar87._8_4_;
                auVar103 = minps(auVar132,auVar87);
                auVar69._0_8_ = auVar103._8_8_;
                auVar69._8_4_ = auVar103._0_4_;
                auVar69._12_4_ = auVar103._4_4_;
                auVar103 = minps(auVar69,auVar103);
                uVar56 = -(uint)(auVar103._0_4_ == auVar87._0_4_);
                uVar57 = -(uint)(auVar103._4_4_ == auVar87._4_4_);
                uVar58 = -(uint)(auVar103._8_4_ == auVar87._8_4_);
                uVar59 = -(uint)(auVar103._12_4_ == auVar87._12_4_);
                auVar88._0_4_ = uVar56 & aVar113._0_4_;
                auVar88._4_4_ = uVar57 & aVar113._4_4_;
                auVar88._8_4_ = uVar58 & aVar113._8_4_;
                auVar88._12_4_ = uVar59 & aVar113._12_4_;
                iVar30 = movmskps((int)local_1220,auVar88);
                uVar52 = 0xffffffff;
                uVar53 = 0xffffffff;
                uVar54 = 0xffffffff;
                uVar55 = 0xffffffff;
                if (iVar30 != 0) {
                  uVar52 = uVar56;
                  uVar53 = uVar57;
                  uVar54 = uVar58;
                  uVar55 = uVar59;
                }
                auVar114._0_4_ = aVar113._0_4_ & uVar52;
                auVar114._4_4_ = aVar113._4_4_ & uVar53;
                auVar114._8_4_ = aVar113._8_4_ & uVar54;
                auVar114._12_4_ = aVar113._12_4_ & uVar55;
                uVar40 = movmskps(iVar30,auVar114);
                uVar44 = CONCAT44((int)((ulong)local_1220 >> 0x20),uVar40);
                lVar45 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                  }
                }
                valid.field_0 = aVar113;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar65 = local_1128[lVar45];
                  fVar64 = local_1118[lVar45];
                  fVar77 = local_10e8[lVar45 + -4];
                  fVar74 = local_10e8[lVar45];
                  fVar75 = local_10d8[lVar45];
                  *(float *)(ray + k * 4 + 0x80) = local_1108[lVar45];
                  *(float *)(ray + k * 4 + 0xc0) = fVar77;
                  *(float *)(ray + k * 4 + 0xd0) = fVar74;
                  *(float *)(ray + k * 4 + 0xe0) = fVar75;
                  *(float *)(ray + k * 4 + 0xf0) = fVar65;
                  *(float *)(ray + k * 4 + 0x100) = fVar64;
                  *(uint *)(ray + k * 4 + 0x110) = uVar37;
                  *(uint *)(ray + k * 4 + 0x120) = (uint)uStack_1250;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  pGVar38 = (GridSOA *)context;
                }
                else {
                  local_1258 = CONCAT44((uint)uStack_1250,(uint)uStack_1250);
                  uStack_1250._4_4_ = (uint)uStack_1250;
                  local_1288 = CONCAT44(uVar37,uVar37);
                  auVar28 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar31);
                  uStack_12bc = (undefined4)
                                ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar31 + 8) >> 0x20);
                  while( true ) {
                    local_1098 = local_1128[lVar45];
                    fVar65 = local_1118[lVar45];
                    *(float *)(ray + k * 4 + 0x80) = local_1108[lVar45];
                    args.context = context->user;
                    local_1088._4_4_ = fVar65;
                    local_1088._0_4_ = fVar65;
                    local_1088._8_4_ = fVar65;
                    local_1088._12_4_ = fVar65;
                    local_10c8 = local_10e8[lVar45 + -4];
                    fVar65 = local_10e8[lVar45];
                    fVar77 = local_10d8[lVar45];
                    local_10b8._4_4_ = fVar65;
                    local_10b8._0_4_ = fVar65;
                    local_10b8._8_4_ = fVar65;
                    local_10b8._12_4_ = fVar65;
                    local_10a8._4_4_ = fVar77;
                    local_10a8._0_4_ = fVar77;
                    local_10a8._8_4_ = fVar77;
                    local_10a8._12_4_ = fVar77;
                    fStack_10c4 = local_10c8;
                    fStack_10c0 = local_10c8;
                    fStack_10bc = local_10c8;
                    fStack_1094 = local_1098;
                    fStack_1090 = local_1098;
                    fStack_108c = local_1098;
                    local_1078 = local_1288;
                    uStack_1070 = CONCAT44(uVar37,uVar37);
                    local_1068 = local_1258;
                    uStack_1060 = uStack_1250;
                    local_1058 = (args.context)->instID[0];
                    uStack_1054 = local_1058;
                    uStack_1050 = local_1058;
                    uStack_104c = local_1058;
                    local_1048 = (args.context)->instPrimID[0];
                    uStack_1044 = local_1048;
                    uStack_1040 = local_1048;
                    uStack_103c = local_1048;
                    local_1238._12_4_ = uStack_12bc;
                    local_1238._0_12_ = auVar28;
                    args.valid = (int *)local_1238;
                    pGVar38 = (GridSOA *)pGVar15->userPtr;
                    args.hit = (RTCHitN *)&local_10c8;
                    args.N = 4;
                    p_Var35 = pGVar15->intersectionFilterN;
                    args.geometryUserPtr = pGVar38;
                    args.ray = (RTCRayN *)ray;
                    if (p_Var35 != (RTCFilterFunctionN)0x0) {
                      p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&args);
                    }
                    auVar94._0_4_ = -(uint)(local_1238._0_4_ == 0);
                    auVar94._4_4_ = -(uint)(local_1238._4_4_ == 0);
                    auVar94._8_4_ = -(uint)(local_1238._8_4_ == 0);
                    auVar94._12_4_ = -(uint)(local_1238._12_4_ == 0);
                    uVar52 = movmskps((int)p_Var35,auVar94);
                    pRVar34 = (RTCRayN *)(ulong)(uVar52 ^ 0xf);
                    if ((uVar52 ^ 0xf) == 0) {
                      auVar94 = auVar94 ^ _DAT_01f46b70;
                    }
                    else {
                      pGVar38 = (GridSOA *)context->args;
                      pcVar36 = *(code **)&pGVar38->height;
                      if ((pcVar36 != (code *)0x0) &&
                         ((((pGVar38->troot).ptr & 2) != 0 ||
                          (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                        pcVar36 = (code *)(*pcVar36)(&args);
                      }
                      auVar72._0_4_ = -(uint)(local_1238._0_4_ == 0);
                      auVar72._4_4_ = -(uint)(local_1238._4_4_ == 0);
                      auVar72._8_4_ = -(uint)(local_1238._8_4_ == 0);
                      auVar72._12_4_ = -(uint)(local_1238._12_4_ == 0);
                      auVar94 = auVar72 ^ _DAT_01f46b70;
                      uVar52 = movmskps((int)pcVar36,auVar72);
                      pRVar34 = (RTCRayN *)(ulong)(uVar52 ^ 0xf);
                      if ((uVar52 ^ 0xf) != 0) {
                        auVar120._0_4_ = *(uint *)(args.ray + 0xc0) & auVar72._0_4_;
                        auVar120._4_4_ = *(uint *)(args.ray + 0xc4) & auVar72._4_4_;
                        auVar120._8_4_ = *(uint *)(args.ray + 200) & auVar72._8_4_;
                        auVar120._12_4_ = *(uint *)(args.ray + 0xcc) & auVar72._12_4_;
                        auVar172._0_4_ = ~auVar72._0_4_ & *(uint *)args.hit;
                        auVar172._4_4_ = ~auVar72._4_4_ & *(uint *)(args.hit + 4);
                        auVar172._8_4_ = ~auVar72._8_4_ & *(uint *)(args.hit + 8);
                        auVar172._12_4_ = ~auVar72._12_4_ & *(uint *)(args.hit + 0xc);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar172 | auVar120;
                        uVar52 = *(uint *)(args.hit + 0x14);
                        uVar53 = *(uint *)(args.hit + 0x18);
                        uVar54 = *(uint *)(args.hit + 0x1c);
                        *(uint *)(args.ray + 0xd0) =
                             ~auVar72._0_4_ & *(uint *)(args.hit + 0x10) |
                             *(uint *)(args.ray + 0xd0) & auVar72._0_4_;
                        *(uint *)(args.ray + 0xd4) =
                             ~auVar72._4_4_ & uVar52 | *(uint *)(args.ray + 0xd4) & auVar72._4_4_;
                        *(uint *)(args.ray + 0xd8) =
                             ~auVar72._8_4_ & uVar53 | *(uint *)(args.ray + 0xd8) & auVar72._8_4_;
                        *(uint *)(args.ray + 0xdc) =
                             ~auVar72._12_4_ & uVar54 | *(uint *)(args.ray + 0xdc) & auVar72._12_4_;
                        auVar149._0_4_ = *(uint *)(args.ray + 0xe0) & auVar72._0_4_;
                        auVar149._4_4_ = *(uint *)(args.ray + 0xe4) & auVar72._4_4_;
                        auVar149._8_4_ = *(uint *)(args.ray + 0xe8) & auVar72._8_4_;
                        auVar149._12_4_ = *(uint *)(args.ray + 0xec) & auVar72._12_4_;
                        auVar121._0_4_ = ~auVar72._0_4_ & *(uint *)(args.hit + 0x20);
                        auVar121._4_4_ = ~auVar72._4_4_ & *(uint *)(args.hit + 0x24);
                        auVar121._8_4_ = ~auVar72._8_4_ & *(uint *)(args.hit + 0x28);
                        auVar121._12_4_ = ~auVar72._12_4_ & *(uint *)(args.hit + 0x2c);
                        *(undefined1 (*) [16])(args.ray + 0xe0) = auVar121 | auVar149;
                        auVar162._0_4_ = *(uint *)(args.ray + 0xf0) & auVar72._0_4_;
                        auVar162._4_4_ = *(uint *)(args.ray + 0xf4) & auVar72._4_4_;
                        auVar162._8_4_ = *(uint *)(args.ray + 0xf8) & auVar72._8_4_;
                        auVar162._12_4_ = *(uint *)(args.ray + 0xfc) & auVar72._12_4_;
                        auVar122._0_4_ = ~auVar72._0_4_ & *(uint *)(args.hit + 0x30);
                        auVar122._4_4_ = ~auVar72._4_4_ & *(uint *)(args.hit + 0x34);
                        auVar122._8_4_ = ~auVar72._8_4_ & *(uint *)(args.hit + 0x38);
                        auVar122._12_4_ = ~auVar72._12_4_ & *(uint *)(args.hit + 0x3c);
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar122 | auVar162;
                        uVar52 = *(uint *)(args.hit + 0x44);
                        uVar53 = *(uint *)(args.hit + 0x48);
                        uVar54 = *(uint *)(args.hit + 0x4c);
                        *(uint *)(args.ray + 0x100) =
                             ~auVar72._0_4_ & *(uint *)(args.hit + 0x40) |
                             *(uint *)(args.ray + 0x100) & auVar72._0_4_;
                        *(uint *)(args.ray + 0x104) =
                             ~auVar72._4_4_ & uVar52 | *(uint *)(args.ray + 0x104) & auVar72._4_4_;
                        *(uint *)(args.ray + 0x108) =
                             ~auVar72._8_4_ & uVar53 | *(uint *)(args.ray + 0x108) & auVar72._8_4_;
                        *(uint *)(args.ray + 0x10c) =
                             ~auVar72._12_4_ & uVar54 | *(uint *)(args.ray + 0x10c) & auVar72._12_4_
                        ;
                        uVar52 = *(uint *)(args.hit + 0x54);
                        uVar53 = *(uint *)(args.hit + 0x58);
                        uVar54 = *(uint *)(args.hit + 0x5c);
                        *(uint *)(args.ray + 0x110) =
                             *(uint *)(args.ray + 0x110) & auVar72._0_4_ |
                             ~auVar72._0_4_ & *(uint *)(args.hit + 0x50);
                        *(uint *)(args.ray + 0x114) =
                             *(uint *)(args.ray + 0x114) & auVar72._4_4_ | ~auVar72._4_4_ & uVar52;
                        *(uint *)(args.ray + 0x118) =
                             *(uint *)(args.ray + 0x118) & auVar72._8_4_ | ~auVar72._8_4_ & uVar53;
                        *(uint *)(args.ray + 0x11c) =
                             *(uint *)(args.ray + 0x11c) & auVar72._12_4_ | ~auVar72._12_4_ & uVar54
                        ;
                        uVar52 = *(uint *)(args.hit + 100);
                        uVar53 = *(uint *)(args.hit + 0x68);
                        uVar54 = *(uint *)(args.hit + 0x6c);
                        *(uint *)(args.ray + 0x120) =
                             *(uint *)(args.ray + 0x120) & auVar72._0_4_ |
                             ~auVar72._0_4_ & *(uint *)(args.hit + 0x60);
                        *(uint *)(args.ray + 0x124) =
                             *(uint *)(args.ray + 0x124) & auVar72._4_4_ | ~auVar72._4_4_ & uVar52;
                        *(uint *)(args.ray + 0x128) =
                             *(uint *)(args.ray + 0x128) & auVar72._8_4_ | ~auVar72._8_4_ & uVar53;
                        *(uint *)(args.ray + 300) =
                             *(uint *)(args.ray + 300) & auVar72._12_4_ | ~auVar72._12_4_ & uVar54;
                        auVar123._0_4_ = *(uint *)(args.ray + 0x130) & auVar72._0_4_;
                        auVar123._4_4_ = *(uint *)(args.ray + 0x134) & auVar72._4_4_;
                        auVar123._8_4_ = *(uint *)(args.ray + 0x138) & auVar72._8_4_;
                        auVar123._12_4_ = *(uint *)(args.ray + 0x13c) & auVar72._12_4_;
                        auVar135._0_4_ = ~auVar72._0_4_ & *(uint *)(args.hit + 0x70);
                        auVar135._4_4_ = ~auVar72._4_4_ & *(uint *)(args.hit + 0x74);
                        auVar135._8_4_ = ~auVar72._8_4_ & *(uint *)(args.hit + 0x78);
                        auVar135._12_4_ = ~auVar72._12_4_ & *(uint *)(args.hit + 0x7c);
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar135 | auVar123;
                        *(undefined1 (*) [16])(args.ray + 0x140) =
                             ~auVar72 & *(undefined1 (*) [16])(args.hit + 0x80) |
                             *(undefined1 (*) [16])(args.ray + 0x140) & auVar72;
                        pRVar34 = args.ray;
                        pGVar38 = (GridSOA *)args.hit;
                      }
                    }
                    auVar95._0_4_ = auVar94._0_4_ << 0x1f;
                    auVar95._4_4_ = auVar94._4_4_ << 0x1f;
                    auVar95._8_4_ = auVar94._8_4_ << 0x1f;
                    auVar95._12_4_ = auVar94._12_4_ << 0x1f;
                    iVar30 = movmskps((int)pRVar34,auVar95);
                    if (iVar30 == 0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar64;
                    }
                    else {
                      fVar64 = *(float *)(ray + k * 4 + 0x80);
                    }
                    *(undefined4 *)(local_1238 + lVar45 * 4 + -0x10) = 0;
                    valid.field_0.i[0] = -(uint)(fVar138 <= fVar64) & valid.field_0.i[0];
                    valid.field_0.i[1] = -(uint)(fVar139 <= fVar64) & valid.field_0.i[1];
                    valid.field_0.i[2] = -(uint)(fVar125 <= fVar64) & valid.field_0.i[2];
                    valid.field_0.i[3] = -(uint)(fVar137 <= fVar64) & valid.field_0.i[3];
                    iVar30 = movmskps(iVar30,(undefined1  [16])valid.field_0);
                    if (iVar30 == 0) break;
                    auVar96._0_4_ = valid.field_0.i[0] & (uint)fVar138;
                    auVar96._4_4_ = valid.field_0.i[1] & (uint)fVar139;
                    auVar96._8_4_ = valid.field_0.i[2] & (uint)fVar125;
                    auVar96._12_4_ = valid.field_0.i[3] & (uint)fVar137;
                    auVar124._0_8_ =
                         CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                    auVar124._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                    auVar124._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                    auVar124 = auVar124 | auVar96;
                    auVar136._4_4_ = auVar124._0_4_;
                    auVar136._0_4_ = auVar124._4_4_;
                    auVar136._8_4_ = auVar124._12_4_;
                    auVar136._12_4_ = auVar124._8_4_;
                    auVar103 = minps(auVar136,auVar124);
                    auVar97._0_8_ = auVar103._8_8_;
                    auVar97._8_4_ = auVar103._0_4_;
                    auVar97._12_4_ = auVar103._4_4_;
                    auVar103 = minps(auVar97,auVar103);
                    auVar98._0_8_ =
                         CONCAT44(-(uint)(auVar103._4_4_ == auVar124._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar103._0_4_ == auVar124._0_4_) & valid.field_0.i[0]);
                    auVar98._8_4_ = -(uint)(auVar103._8_4_ == auVar124._8_4_) & valid.field_0.i[2];
                    auVar98._12_4_ =
                         -(uint)(auVar103._12_4_ == auVar124._12_4_) & valid.field_0.i[3];
                    iVar30 = movmskps(iVar30,auVar98);
                    aVar73 = valid.field_0;
                    if (iVar30 != 0) {
                      aVar73.i[2] = auVar98._8_4_;
                      aVar73._0_8_ = auVar98._0_8_;
                      aVar73.i[3] = auVar98._12_4_;
                    }
                    uVar40 = movmskps(iVar30,(undefined1  [16])aVar73);
                    uVar44 = CONCAT44((int)((ulong)pRVar34 >> 0x20),uVar40);
                    lVar45 = 0;
                    if (uVar44 != 0) {
                      for (; (uVar44 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar40 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar103._4_4_ = uVar40;
      auVar103._0_4_ = uVar40;
      auVar103._8_4_ = uVar40;
      auVar103._12_4_ = uVar40;
      fVar65 = local_1008;
      fVar64 = fStack_1004;
      fVar77 = fStack_1000;
      fVar74 = fStack_ffc;
      fVar75 = local_1028;
      fVar76 = fStack_1024;
      fVar125 = fStack_1020;
      fVar137 = fStack_101c;
      iVar30 = local_1038;
      iVar230 = iStack_1034;
      iVar234 = iStack_1030;
      iVar238 = iStack_102c;
      fVar138 = local_fd8;
      fVar139 = fStack_fd4;
      fVar141 = fStack_fd0;
      fVar151 = fStack_fcc;
      fVar166 = local_fe8;
      fVar181 = fStack_fe4;
      fVar140 = fStack_fe0;
      fVar173 = fStack_fdc;
      fVar150 = local_ff8;
      fVar174 = fStack_ff4;
      fVar152 = fStack_ff0;
      fVar182 = fStack_fec;
      fVar153 = local_1018;
      fVar184 = fStack_1014;
      fVar185 = fStack_1010;
      fVar176 = fStack_100c;
    }
    else {
      pGVar38 = *(GridSOA **)(uVar44 & 0xfffffffffffffff0);
      sVar16 = (pGVar38->troot).ptr;
      (local_1228->super_Precalculations).grid = pGVar38;
      uVar40 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar103._4_4_ = uVar40;
      auVar103._0_4_ = uVar40;
      auVar103._8_4_ = uVar40;
      auVar103._12_4_ = uVar40;
      if (sVar16 != 0) {
        (pSVar46->ptr).ptr = sVar16;
        pSVar46->dist = 0;
        pSVar46 = pSVar46 + 1;
      }
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }